

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O3

void ncnn::convdw3x3s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  void **ppvVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  void *pvVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float *pfVar230;
  float *pfVar231;
  float *pfVar232;
  int iVar233;
  float *pfVar234;
  long lVar235;
  long lVar236;
  uint uVar237;
  uint uVar238;
  long lVar239;
  int iVar240;
  uint uVar241;
  float *pfVar242;
  long lVar243;
  float *pfVar244;
  float *pfVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float in_register_000012dc;
  float fVar251;
  float fVar252;
  float fVar253;
  float in_register_0000135c;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float in_register_0000139c;
  float fVar258;
  float fVar259;
  float in_register_000013dc;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float in_register_0000141c;
  float fVar265;
  float in_register_0000145c;
  float in_register_0000149c;
  float fVar266;
  float in_register_000014dc;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float in_register_0000151c;
  float fVar271;
  float fVar272;
  float in_register_0000155c;
  float in_register_0000159c;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  
  iVar12 = bottom_blob->c;
  if (0 < (long)iVar12) {
    uVar13 = top_blob->w;
    uVar14 = top_blob->h;
    lVar2 = (long)bottom_blob->w * 8 + 0x10;
    lVar236 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar273 = 0.0;
        fVar274 = 0.0;
        fVar275 = 0.0;
        fVar276 = 0.0;
        fVar277 = 0.0;
        fVar278 = 0.0;
        fVar279 = 0.0;
        fVar280 = 0.0;
      }
      else {
        ppvVar1 = &_bias->data + lVar236 * 4;
        fVar273 = *(float *)ppvVar1;
        fVar274 = *(float *)((long)ppvVar1 + 4);
        fVar275 = *(float *)(ppvVar1 + 1);
        fVar276 = *(float *)((long)ppvVar1 + 0xc);
        fVar277 = *(float *)(ppvVar1 + 2);
        fVar278 = *(float *)((long)ppvVar1 + 0x14);
        fVar279 = *(float *)(ppvVar1 + 3);
        fVar280 = *(float *)((long)ppvVar1 + 0x1c);
      }
      pfVar242 = (float *)(top_blob->cstep * lVar236 * top_blob->elemsize + (long)top_blob->data);
      lVar243 = kernel->w * lVar236 * kernel->elemsize;
      pfVar230 = (float *)(bottom_blob->cstep * lVar236 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
      lVar239 = (long)bottom_blob->w * bottom_blob->elemsize;
      pfVar244 = (float *)((long)pfVar230 + lVar239);
      pvVar15 = kernel->data;
      pfVar231 = (float *)((long)pfVar230 + lVar239 * 2);
      uVar241 = 0;
      if (1 < (int)uVar14) {
        lVar239 = lVar239 * 3 + (long)pfVar230;
        pfVar234 = (float *)(top_blob->elemsize * (long)top_blob->w + (long)pfVar242);
        iVar233 = 0;
        do {
          if ((int)uVar13 < 4) {
            uVar241 = 0;
          }
          else {
            iVar240 = 3;
            lVar235 = 0;
            do {
              pfVar245 = (float *)((long)pfVar230 + lVar235 + 0x20);
              fVar16 = *pfVar245;
              fVar17 = pfVar245[1];
              fVar18 = pfVar245[2];
              fVar19 = pfVar245[3];
              fVar20 = pfVar245[4];
              fVar21 = pfVar245[5];
              fVar22 = pfVar245[6];
              pfVar3 = (float *)((long)pfVar230 + lVar235 + 0x40);
              fVar23 = *pfVar3;
              fVar24 = pfVar3[1];
              fVar25 = pfVar3[2];
              fVar26 = pfVar3[3];
              fVar27 = pfVar3[4];
              fVar28 = pfVar3[5];
              fVar29 = pfVar3[6];
              pfVar232 = (float *)((long)pfVar230 + lVar235 + 0x60);
              fVar30 = *pfVar232;
              fVar31 = pfVar232[1];
              fVar32 = pfVar232[2];
              fVar33 = pfVar232[3];
              fVar34 = pfVar232[4];
              fVar35 = pfVar232[5];
              fVar36 = pfVar232[6];
              fVar37 = pfVar232[7];
              pfVar232 = (float *)((long)pfVar230 + lVar235 + 0x80);
              fVar38 = *pfVar232;
              fVar39 = pfVar232[1];
              fVar40 = pfVar232[2];
              fVar41 = pfVar232[3];
              fVar42 = pfVar232[4];
              fVar43 = pfVar232[5];
              fVar44 = pfVar232[6];
              pfVar7 = (float *)((long)pvVar15 + lVar243);
              fVar45 = *pfVar7;
              fVar46 = pfVar7[1];
              fVar47 = pfVar7[2];
              fVar48 = pfVar7[3];
              fVar49 = pfVar7[4];
              fVar50 = pfVar7[5];
              fVar51 = pfVar7[6];
              pfVar4 = (float *)((long)pvVar15 + lVar243 + 0x20);
              fVar52 = *pfVar4;
              fVar53 = pfVar4[1];
              fVar54 = pfVar4[2];
              fVar55 = pfVar4[3];
              fVar56 = pfVar4[4];
              fVar57 = pfVar4[5];
              fVar58 = pfVar4[6];
              pfVar5 = (float *)((long)pvVar15 + lVar243 + 0x40);
              fVar59 = *pfVar5;
              fVar60 = pfVar5[1];
              fVar61 = pfVar5[2];
              fVar62 = pfVar5[3];
              fVar63 = pfVar5[4];
              fVar64 = pfVar5[5];
              fVar65 = pfVar5[6];
              pfVar6 = (float *)((long)pvVar15 + lVar243 + 0x60);
              fVar66 = *pfVar6;
              fVar67 = pfVar6[1];
              fVar68 = pfVar6[2];
              fVar69 = pfVar6[3];
              fVar70 = pfVar6[4];
              fVar71 = pfVar6[5];
              fVar72 = pfVar6[6];
              pfVar232 = (float *)((long)pfVar230 + lVar235);
              fVar73 = pfVar232[1];
              fVar74 = pfVar232[2];
              fVar75 = pfVar232[3];
              fVar76 = pfVar232[4];
              fVar77 = pfVar232[5];
              fVar78 = pfVar232[6];
              fVar246 = in_register_0000141c + fVar280 + pfVar245[7] + pfVar3[7];
              fVar247 = in_register_0000145c + fVar280 + in_register_0000151c + fVar246;
              fVar248 = in_register_0000149c + fVar280 + in_register_0000155c + fVar247;
              pfVar245 = (float *)((long)pfVar230 + lVar235 + 0xa0);
              fVar79 = *pfVar245;
              fVar80 = pfVar245[1];
              fVar81 = pfVar245[2];
              fVar82 = pfVar245[3];
              fVar83 = pfVar245[4];
              fVar84 = pfVar245[5];
              fVar85 = pfVar245[6];
              fVar249 = in_register_000014dc + fVar280 + in_register_0000159c + fVar248;
              pfVar8 = (float *)((long)pvVar15 + lVar243 + 0x80);
              fVar86 = *pfVar8;
              fVar87 = pfVar8[1];
              fVar88 = pfVar8[2];
              fVar89 = pfVar8[3];
              fVar90 = pfVar8[4];
              fVar91 = pfVar8[5];
              fVar92 = pfVar8[6];
              pfVar245 = (float *)((long)pfVar244 + lVar235);
              fVar93 = *pfVar245;
              fVar94 = pfVar245[1];
              fVar95 = pfVar245[2];
              fVar96 = pfVar245[3];
              fVar97 = pfVar245[4];
              fVar98 = pfVar245[5];
              fVar99 = pfVar245[6];
              pfVar3 = (float *)((long)pfVar244 + lVar235 + 0x20);
              fVar100 = *pfVar3;
              fVar101 = pfVar3[1];
              fVar102 = pfVar3[2];
              fVar103 = pfVar3[3];
              fVar104 = pfVar3[4];
              fVar105 = pfVar3[5];
              fVar106 = pfVar3[6];
              fVar107 = pfVar3[7];
              pfVar3 = (float *)((long)pfVar244 + lVar235 + 0x40);
              fVar108 = *pfVar3;
              fVar109 = pfVar3[1];
              fVar110 = pfVar3[2];
              fVar111 = pfVar3[3];
              fVar112 = pfVar3[4];
              fVar113 = pfVar3[5];
              fVar114 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar244 + lVar235 + 0x60);
              fVar115 = *pfVar3;
              fVar116 = pfVar3[1];
              fVar117 = pfVar3[2];
              fVar261 = pfVar3[3];
              fVar263 = pfVar3[4];
              fVar118 = pfVar3[5];
              fVar119 = pfVar3[6];
              fVar265 = in_register_0000141c + fVar280 + fVar249;
              pfVar9 = (float *)((long)pfVar244 + lVar235 + 0x80);
              fVar120 = *pfVar9;
              fVar121 = pfVar9[1];
              fVar122 = pfVar9[2];
              fVar123 = pfVar9[3];
              fVar124 = pfVar9[4];
              fVar125 = pfVar9[5];
              fVar126 = pfVar9[6];
              fVar271 = pfVar245[7] + fVar280;
              fVar267 = fVar271 + in_register_0000155c + in_register_000014dc + fVar280;
              fVar268 = fVar267 + fVar271;
              fVar260 = fVar271 + fVar280 + fVar268 + fVar271;
              pfVar245 = (float *)((long)pfVar244 + lVar235 + 0xa0);
              fVar271 = *pfVar245;
              fVar127 = pfVar245[1];
              fVar128 = pfVar245[2];
              fVar129 = pfVar245[3];
              fVar130 = pfVar245[4];
              fVar131 = pfVar245[5];
              fVar132 = pfVar245[6];
              fVar252 = pfVar4[7] + pfVar5[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0xa0);
              fVar133 = *pfVar245;
              fVar134 = pfVar245[1];
              fVar135 = pfVar245[2];
              fVar136 = pfVar245[3];
              fVar137 = pfVar245[4];
              fVar138 = pfVar245[5];
              fVar139 = pfVar245[6];
              fVar140 = pfVar245[7];
              fVar254 = fVar37 + fVar249 + pfVar4[7];
              fVar248 = fVar249 + fVar37 + pfVar9[7] + fVar248;
              fVar250 = in_register_0000155c + fVar37 + fVar248 + fVar249;
              pfVar245 = (float *)((long)pfVar231 + lVar235);
              fVar141 = *pfVar245;
              fVar142 = pfVar245[1];
              fVar143 = pfVar245[2];
              fVar259 = pfVar245[3];
              fVar144 = pfVar245[4];
              fVar145 = pfVar245[5];
              fVar146 = pfVar245[6];
              fVar147 = pfVar245[7];
              pfVar245 = (float *)((long)pfVar231 + lVar235 + 0x20);
              fVar148 = *pfVar245;
              fVar149 = pfVar245[1];
              fVar150 = pfVar245[2];
              fVar151 = pfVar245[3];
              fVar152 = pfVar245[4];
              fVar153 = pfVar245[5];
              fVar154 = pfVar245[6];
              pfVar4 = (float *)((long)pfVar231 + lVar235 + 0x40);
              fVar155 = *pfVar4;
              fVar156 = pfVar4[1];
              fVar157 = pfVar4[2];
              fVar158 = pfVar4[3];
              fVar159 = pfVar4[4];
              fVar160 = pfVar4[5];
              fVar161 = pfVar4[6];
              fVar281 = pfVar3[7] + fVar250;
              pfVar5 = (float *)((long)pfVar231 + lVar235 + 0x60);
              fVar162 = *pfVar5;
              fVar163 = pfVar5[1];
              fVar164 = pfVar5[2];
              fVar165 = pfVar5[3];
              fVar166 = pfVar5[4];
              fVar257 = pfVar5[5];
              fVar167 = pfVar5[6];
              pfVar9 = (float *)((long)pfVar231 + lVar235 + 0x80);
              fVar168 = *pfVar9;
              fVar169 = pfVar9[1];
              fVar170 = pfVar9[2];
              fVar171 = pfVar9[3];
              fVar172 = pfVar9[4];
              fVar173 = pfVar9[5];
              fVar174 = pfVar9[6];
              fVar175 = pfVar9[7];
              pfVar9 = (float *)((long)pvVar15 + lVar243 + 0xc0);
              fVar176 = *pfVar9;
              fVar177 = pfVar9[1];
              fVar178 = pfVar9[2];
              fVar179 = pfVar9[3];
              fVar180 = pfVar9[4];
              fVar181 = pfVar9[5];
              fVar182 = pfVar9[6];
              fVar183 = pfVar9[7];
              pfVar9 = (float *)((long)pvVar15 + lVar243 + 0xe0);
              fVar184 = *pfVar9;
              fVar185 = pfVar9[1];
              fVar186 = pfVar9[2];
              fVar187 = pfVar9[3];
              fVar188 = pfVar9[4];
              fVar189 = pfVar9[5];
              fVar190 = pfVar9[6];
              fVar191 = pfVar9[7];
              fVar267 = fVar281 + fVar147 + fVar267;
              fVar281 = fVar281 + pfVar3[7] + fVar250;
              in_register_000013dc = fVar250 + fVar260 + fVar281 + fVar260;
              pfVar3 = (float *)((long)pfVar231 + lVar235 + 0xa0);
              fVar260 = *pfVar3;
              fVar251 = pfVar3[1];
              fVar258 = pfVar3[2];
              fVar262 = pfVar3[3];
              fVar192 = pfVar3[4];
              fVar193 = pfVar3[5];
              fVar194 = pfVar3[6];
              in_register_000012dc = pfVar7[7] + fVar280 + fVar252 + fVar140 + pfVar6[7] + pfVar8[7]
              ;
              pfVar6 = (float *)((long)pvVar15 + lVar243 + 0x100);
              fVar216 = *pfVar6;
              fVar217 = pfVar6[1];
              fVar218 = pfVar6[2];
              fVar219 = pfVar6[3];
              fVar220 = pfVar6[4];
              fVar221 = pfVar6[5];
              fVar222 = pfVar6[6];
              in_register_0000151c = pfVar6[7];
              fVar255 = pfVar4[7] + fVar147 + fVar254;
              in_register_0000149c = fVar255 + fVar265 + fVar252 + fVar246;
              in_register_0000135c = pfVar245[7] + fVar147 + fVar255 + fVar254 + fVar247;
              in_register_0000141c = fVar249 + fVar37 + fVar147 + pfVar3[7] + fVar250;
              pfVar245 = (float *)(lVar239 + 0x20 + lVar235);
              fVar37 = *pfVar245;
              fVar246 = pfVar245[1];
              fVar247 = pfVar245[2];
              fVar249 = pfVar245[3];
              fVar250 = pfVar245[4];
              fVar252 = pfVar245[5];
              fVar254 = pfVar245[6];
              fVar255 = pfVar245[7];
              pfVar245 = (float *)(lVar239 + 0x40 + lVar235);
              fVar253 = *pfVar245;
              fVar256 = pfVar245[1];
              fVar264 = pfVar245[2];
              fVar266 = pfVar245[3];
              fVar269 = pfVar245[4];
              fVar270 = pfVar245[5];
              fVar272 = pfVar245[6];
              in_register_0000145c = pfVar245[7];
              pfVar245 = (float *)(lVar239 + 0x60 + lVar235);
              fVar209 = *pfVar245;
              fVar210 = pfVar245[1];
              fVar211 = pfVar245[2];
              fVar212 = pfVar245[3];
              fVar213 = pfVar245[4];
              fVar214 = pfVar245[5];
              fVar215 = pfVar245[6];
              in_register_000014dc = pfVar245[7];
              pfVar245 = (float *)(lVar239 + lVar235);
              fVar195 = *pfVar245;
              fVar196 = pfVar245[1];
              fVar197 = pfVar245[2];
              fVar198 = pfVar245[3];
              fVar199 = pfVar245[4];
              fVar200 = pfVar245[5];
              fVar201 = pfVar245[6];
              in_register_0000155c = pfVar5[7] + fVar140;
              pfVar245 = (float *)(lVar239 + 0x80 + lVar235);
              fVar223 = *pfVar245;
              fVar224 = pfVar245[1];
              fVar225 = pfVar245[2];
              fVar226 = pfVar245[3];
              fVar227 = pfVar245[4];
              fVar228 = pfVar245[5];
              fVar229 = pfVar245[6];
              in_register_0000159c = pfVar245[7];
              in_register_0000139c =
                   in_register_000013dc + in_register_0000145c + pfVar5[7] + fVar267;
              pfVar245 = (float *)(lVar239 + 0xa0 + lVar235);
              fVar202 = *pfVar245;
              fVar203 = pfVar245[1];
              fVar204 = pfVar245[2];
              fVar205 = pfVar245[3];
              fVar206 = pfVar245[4];
              fVar207 = pfVar245[5];
              fVar208 = pfVar245[6];
              pfVar245 = (float *)((long)pfVar242 + lVar235);
              *pfVar245 = fVar155 * fVar216 + fVar141 * fVar176 + fVar148 * fVar184 +
                          fVar100 * fVar86 + fVar93 * fVar66 + fVar108 * fVar133 +
                          fVar45 * *pfVar232 + fVar273 + fVar16 * fVar52 + fVar23 * fVar59;
              pfVar245[1] = fVar156 * fVar217 + fVar142 * fVar177 + fVar149 * fVar185 +
                            fVar101 * fVar87 + fVar94 * fVar67 + fVar109 * fVar134 +
                            fVar46 * fVar73 + fVar274 + fVar17 * fVar53 + fVar24 * fVar60;
              pfVar245[2] = fVar157 * fVar218 + fVar143 * fVar178 + fVar150 * fVar186 +
                            fVar102 * fVar88 + fVar95 * fVar68 + fVar110 * fVar135 +
                            fVar47 * fVar74 + fVar275 + fVar18 * fVar54 + fVar25 * fVar61;
              pfVar245[3] = fVar158 * fVar219 + fVar259 * fVar179 + fVar151 * fVar187 +
                            fVar103 * fVar89 + fVar96 * fVar69 + fVar111 * fVar136 +
                            fVar48 * fVar75 + fVar276 + fVar19 * fVar55 + fVar26 * fVar62;
              pfVar245[4] = fVar159 * fVar220 + fVar144 * fVar180 + fVar152 * fVar188 +
                            fVar104 * fVar90 + fVar97 * fVar70 + fVar112 * fVar137 +
                            fVar49 * fVar76 + fVar277 + fVar20 * fVar56 + fVar27 * fVar63;
              pfVar245[5] = fVar160 * fVar221 + fVar145 * fVar181 + fVar153 * fVar189 +
                            fVar105 * fVar91 + fVar98 * fVar71 + fVar113 * fVar138 +
                            fVar50 * fVar77 + fVar278 + fVar21 * fVar57 + fVar28 * fVar64;
              pfVar245[6] = fVar161 * fVar222 + fVar146 * fVar182 + fVar154 * fVar190 +
                            fVar106 * fVar92 + fVar99 * fVar72 + fVar114 * fVar139 +
                            fVar51 * fVar78 + fVar279 + fVar22 * fVar58 + fVar29 * fVar65;
              pfVar245[7] = in_register_0000149c;
              pfVar232 = (float *)((long)pfVar242 + lVar235 + 0x20);
              *pfVar232 = fVar155 * fVar184 + fVar148 * fVar176 + fVar162 * fVar216 +
                          fVar100 * fVar66 + fVar108 * fVar86 + fVar115 * fVar133 +
                          fVar16 * fVar45 + fVar273 + fVar23 * fVar52 + fVar30 * fVar59;
              pfVar232[1] = fVar156 * fVar185 + fVar149 * fVar177 + fVar163 * fVar217 +
                            fVar101 * fVar67 + fVar109 * fVar87 + fVar116 * fVar134 +
                            fVar17 * fVar46 + fVar274 + fVar24 * fVar53 + fVar31 * fVar60;
              pfVar232[2] = fVar157 * fVar186 + fVar150 * fVar178 + fVar164 * fVar218 +
                            fVar102 * fVar68 + fVar110 * fVar88 + fVar117 * fVar135 +
                            fVar18 * fVar47 + fVar275 + fVar25 * fVar54 + fVar32 * fVar61;
              pfVar232[3] = fVar158 * fVar187 + fVar151 * fVar179 + fVar165 * fVar219 +
                            fVar103 * fVar69 + fVar111 * fVar89 + fVar261 * fVar136 +
                            fVar19 * fVar48 + fVar276 + fVar26 * fVar55 + fVar33 * fVar62;
              pfVar232[4] = fVar159 * fVar188 + fVar152 * fVar180 + fVar166 * fVar220 +
                            fVar104 * fVar70 + fVar112 * fVar90 + fVar263 * fVar137 +
                            fVar20 * fVar49 + fVar277 + fVar27 * fVar56 + fVar34 * fVar63;
              pfVar232[5] = fVar160 * fVar189 + fVar153 * fVar181 + fVar257 * fVar221 +
                            fVar105 * fVar71 + fVar113 * fVar91 + fVar118 * fVar138 +
                            fVar21 * fVar50 + fVar278 + fVar28 * fVar57 + fVar35 * fVar64;
              pfVar232[6] = fVar161 * fVar190 + fVar154 * fVar182 + fVar167 * fVar222 +
                            fVar106 * fVar72 + fVar114 * fVar92 + fVar119 * fVar139 +
                            fVar22 * fVar51 + fVar279 + fVar29 * fVar58 + fVar36 * fVar65;
              pfVar232[7] = in_register_0000135c;
              pfVar232 = (float *)((long)pfVar242 + lVar235 + 0x40);
              *pfVar232 = fVar162 * fVar184 + fVar155 * fVar176 + fVar216 * fVar168 +
                          fVar108 * fVar66 + fVar115 * fVar86 + fVar133 * fVar120 +
                          fVar23 * fVar45 + fVar273 + fVar30 * fVar52 + fVar38 * fVar59;
              pfVar232[1] = fVar163 * fVar185 + fVar156 * fVar177 + fVar217 * fVar169 +
                            fVar109 * fVar67 + fVar116 * fVar87 + fVar134 * fVar121 +
                            fVar24 * fVar46 + fVar274 + fVar31 * fVar53 + fVar39 * fVar60;
              pfVar232[2] = fVar164 * fVar186 + fVar157 * fVar178 + fVar218 * fVar170 +
                            fVar110 * fVar68 + fVar117 * fVar88 + fVar135 * fVar122 +
                            fVar25 * fVar47 + fVar275 + fVar32 * fVar54 + fVar40 * fVar61;
              pfVar232[3] = fVar165 * fVar187 + fVar158 * fVar179 + fVar219 * fVar171 +
                            fVar111 * fVar69 + fVar261 * fVar89 + fVar136 * fVar123 +
                            fVar26 * fVar48 + fVar276 + fVar33 * fVar55 + fVar41 * fVar62;
              pfVar232[4] = fVar166 * fVar188 + fVar159 * fVar180 + fVar220 * fVar172 +
                            fVar112 * fVar70 + fVar263 * fVar90 + fVar137 * fVar124 +
                            fVar27 * fVar49 + fVar277 + fVar34 * fVar56 + fVar42 * fVar63;
              pfVar232[5] = fVar257 * fVar189 + fVar160 * fVar181 + fVar221 * fVar173 +
                            fVar113 * fVar71 + fVar118 * fVar91 + fVar138 * fVar125 +
                            fVar28 * fVar50 + fVar278 + fVar35 * fVar57 + fVar43 * fVar64;
              pfVar232[6] = fVar167 * fVar190 + fVar161 * fVar182 + fVar222 * fVar174 +
                            fVar114 * fVar72 + fVar119 * fVar92 + fVar139 * fVar126 +
                            fVar29 * fVar51 + fVar279 + fVar36 * fVar58 + fVar44 * fVar65;
              pfVar232[7] = fVar265 + fVar147 + fVar175 + fVar248;
              pfVar232 = (float *)((long)pfVar242 + lVar235 + 0x60);
              *pfVar232 = fVar168 * fVar184 + fVar162 * fVar176 + fVar216 * fVar260 +
                          fVar120 * fVar86 + fVar115 * fVar66 + fVar271 * fVar133 +
                          fVar30 * fVar45 + fVar273 + fVar38 * fVar52 + fVar59 * fVar79;
              pfVar232[1] = fVar169 * fVar185 + fVar163 * fVar177 + fVar217 * fVar251 +
                            fVar121 * fVar87 + fVar116 * fVar67 + fVar127 * fVar134 +
                            fVar31 * fVar46 + fVar274 + fVar39 * fVar53 + fVar60 * fVar80;
              pfVar232[2] = fVar170 * fVar186 + fVar164 * fVar178 + fVar218 * fVar258 +
                            fVar122 * fVar88 + fVar117 * fVar68 + fVar128 * fVar135 +
                            fVar32 * fVar47 + fVar275 + fVar40 * fVar54 + fVar61 * fVar81;
              pfVar232[3] = fVar171 * fVar187 + fVar165 * fVar179 + fVar219 * fVar262 +
                            fVar123 * fVar89 + fVar261 * fVar69 + fVar129 * fVar136 +
                            fVar33 * fVar48 + fVar276 + fVar41 * fVar55 + fVar62 * fVar82;
              pfVar232[4] = fVar172 * fVar188 + fVar166 * fVar180 + fVar220 * fVar192 +
                            fVar124 * fVar90 + fVar263 * fVar70 + fVar130 * fVar137 +
                            fVar34 * fVar49 + fVar277 + fVar42 * fVar56 + fVar63 * fVar83;
              pfVar232[5] = fVar173 * fVar189 + fVar257 * fVar181 + fVar221 * fVar193 +
                            fVar125 * fVar91 + fVar118 * fVar71 + fVar131 * fVar138 +
                            fVar35 * fVar50 + fVar278 + fVar43 * fVar57 + fVar64 * fVar84;
              pfVar232[6] = fVar174 * fVar190 + fVar167 * fVar182 + fVar222 * fVar194 +
                            fVar126 * fVar92 + fVar119 * fVar72 + fVar132 * fVar139 +
                            fVar36 * fVar51 + fVar279 + fVar44 * fVar58 + fVar65 * fVar85;
              pfVar232[7] = in_register_0000141c;
              pfVar232 = (float *)((long)pfVar234 + lVar235);
              *pfVar232 = fVar176 * fVar195 + fVar37 * fVar184 + fVar253 * fVar216 +
                          fVar148 * fVar86 + fVar141 * fVar66 + fVar155 * fVar133 +
                          fVar93 * fVar45 + fVar273 + fVar100 * fVar52 + fVar108 * fVar59;
              pfVar232[1] = fVar177 * fVar196 + fVar246 * fVar185 + fVar256 * fVar217 +
                            fVar149 * fVar87 + fVar142 * fVar67 + fVar156 * fVar134 +
                            fVar94 * fVar46 + fVar274 + fVar101 * fVar53 + fVar109 * fVar60;
              pfVar232[2] = fVar178 * fVar197 + fVar247 * fVar186 + fVar264 * fVar218 +
                            fVar150 * fVar88 + fVar143 * fVar68 + fVar157 * fVar135 +
                            fVar95 * fVar47 + fVar275 + fVar102 * fVar54 + fVar110 * fVar61;
              pfVar232[3] = fVar179 * fVar198 + fVar249 * fVar187 + fVar266 * fVar219 +
                            fVar151 * fVar89 + fVar259 * fVar69 + fVar158 * fVar136 +
                            fVar96 * fVar48 + fVar276 + fVar103 * fVar55 + fVar111 * fVar62;
              pfVar232[4] = fVar180 * fVar199 + fVar250 * fVar188 + fVar269 * fVar220 +
                            fVar152 * fVar90 + fVar144 * fVar70 + fVar159 * fVar137 +
                            fVar97 * fVar49 + fVar277 + fVar104 * fVar56 + fVar112 * fVar63;
              pfVar232[5] = fVar181 * fVar200 + fVar252 * fVar189 + fVar270 * fVar221 +
                            fVar153 * fVar91 + fVar145 * fVar71 + fVar160 * fVar138 +
                            fVar98 * fVar50 + fVar278 + fVar105 * fVar57 + fVar113 * fVar64;
              pfVar232[6] = fVar182 * fVar201 + fVar254 * fVar190 + fVar272 * fVar222 +
                            fVar154 * fVar92 + fVar146 * fVar72 + fVar161 * fVar139 +
                            fVar99 * fVar51 + fVar279 + fVar106 * fVar58 + fVar114 * fVar65;
              pfVar232[7] = fVar140 + fVar255 + fVar191 + fVar267;
              pfVar232 = (float *)((long)pfVar234 + lVar235 + 0x20);
              *pfVar232 = fVar162 * fVar133 + fVar155 * fVar86 + fVar148 * fVar66 +
                          fVar108 * fVar52 + fVar115 * fVar59 + fVar100 * fVar45 + fVar273 +
                          fVar37 * fVar176 + fVar253 * fVar184 + fVar209 * fVar216;
              pfVar232[1] = fVar163 * fVar134 + fVar156 * fVar87 + fVar149 * fVar67 +
                            fVar109 * fVar53 + fVar116 * fVar60 + fVar101 * fVar46 + fVar274 +
                            fVar246 * fVar177 + fVar256 * fVar185 + fVar210 * fVar217;
              pfVar232[2] = fVar164 * fVar135 + fVar157 * fVar88 + fVar150 * fVar68 +
                            fVar110 * fVar54 + fVar117 * fVar61 + fVar102 * fVar47 + fVar275 +
                            fVar247 * fVar178 + fVar264 * fVar186 + fVar211 * fVar218;
              pfVar232[3] = fVar165 * fVar136 + fVar158 * fVar89 + fVar151 * fVar69 +
                            fVar111 * fVar55 + fVar261 * fVar62 + fVar103 * fVar48 + fVar276 +
                            fVar249 * fVar179 + fVar266 * fVar187 + fVar212 * fVar219;
              pfVar232[4] = fVar166 * fVar137 + fVar159 * fVar90 + fVar152 * fVar70 +
                            fVar112 * fVar56 + fVar263 * fVar63 + fVar104 * fVar49 + fVar277 +
                            fVar250 * fVar180 + fVar269 * fVar188 + fVar213 * fVar220;
              pfVar232[5] = fVar257 * fVar138 + fVar160 * fVar91 + fVar153 * fVar71 +
                            fVar113 * fVar57 + fVar118 * fVar64 + fVar105 * fVar50 + fVar278 +
                            fVar252 * fVar181 + fVar270 * fVar189 + fVar214 * fVar221;
              pfVar232[6] = fVar167 * fVar139 + fVar161 * fVar92 + fVar154 * fVar72 +
                            fVar114 * fVar58 + fVar119 * fVar65 + fVar106 * fVar51 + fVar279 +
                            fVar254 * fVar182 + fVar272 * fVar190 + fVar215 * fVar222;
              pfVar232[7] = fVar281 + fVar268 + fVar107 + fVar280 +
                            in_register_0000155c + fVar140 + fVar255;
              pfVar232 = (float *)((long)pfVar234 + lVar235 + 0x40);
              *pfVar232 = fVar155 * fVar66 + fVar162 * fVar86 + fVar133 * fVar168 +
                          fVar108 * fVar45 + fVar273 + fVar115 * fVar52 + fVar120 * fVar59 +
                          fVar223 * fVar216 + fVar253 * fVar176 + fVar209 * fVar184;
              pfVar232[1] = fVar156 * fVar67 + fVar163 * fVar87 + fVar134 * fVar169 +
                            fVar109 * fVar46 + fVar274 + fVar116 * fVar53 + fVar121 * fVar60 +
                            fVar224 * fVar217 + fVar256 * fVar177 + fVar210 * fVar185;
              pfVar232[2] = fVar157 * fVar68 + fVar164 * fVar88 + fVar135 * fVar170 +
                            fVar110 * fVar47 + fVar275 + fVar117 * fVar54 + fVar122 * fVar61 +
                            fVar225 * fVar218 + fVar264 * fVar178 + fVar211 * fVar186;
              pfVar232[3] = fVar158 * fVar69 + fVar165 * fVar89 + fVar136 * fVar171 +
                            fVar111 * fVar48 + fVar276 + fVar261 * fVar55 + fVar123 * fVar62 +
                            fVar226 * fVar219 + fVar266 * fVar179 + fVar212 * fVar187;
              pfVar232[4] = fVar159 * fVar70 + fVar166 * fVar90 + fVar137 * fVar172 +
                            fVar112 * fVar49 + fVar277 + fVar263 * fVar56 + fVar124 * fVar63 +
                            fVar227 * fVar220 + fVar269 * fVar180 + fVar213 * fVar188;
              pfVar232[5] = fVar160 * fVar71 + fVar257 * fVar91 + fVar138 * fVar173 +
                            fVar113 * fVar50 + fVar278 + fVar118 * fVar57 + fVar125 * fVar64 +
                            fVar228 * fVar221 + fVar270 * fVar181 + fVar214 * fVar189;
              pfVar232[6] = fVar161 * fVar72 + fVar167 * fVar92 + fVar139 * fVar174 +
                            fVar114 * fVar51 + fVar279 + fVar119 * fVar58 + fVar126 * fVar65 +
                            fVar229 * fVar222 + fVar272 * fVar182 + fVar215 * fVar190;
              pfVar232[7] = in_register_0000139c;
              pfVar232 = (float *)((long)pfVar234 + lVar235 + 0x60);
              *pfVar232 = fVar115 * fVar45 + fVar273 + fVar120 * fVar52 + fVar271 * fVar59 +
                          fVar133 * fVar260 + fVar162 * fVar66 + fVar168 * fVar86 +
                          fVar209 * fVar176 + fVar223 * fVar184 + fVar216 * fVar202;
              pfVar232[1] = fVar116 * fVar46 + fVar274 + fVar121 * fVar53 + fVar127 * fVar60 +
                            fVar134 * fVar251 + fVar163 * fVar67 + fVar169 * fVar87 +
                            fVar210 * fVar177 + fVar224 * fVar185 + fVar217 * fVar203;
              pfVar232[2] = fVar117 * fVar47 + fVar275 + fVar122 * fVar54 + fVar128 * fVar61 +
                            fVar135 * fVar258 + fVar164 * fVar68 + fVar170 * fVar88 +
                            fVar211 * fVar178 + fVar225 * fVar186 + fVar218 * fVar204;
              pfVar232[3] = fVar261 * fVar48 + fVar276 + fVar123 * fVar55 + fVar129 * fVar62 +
                            fVar136 * fVar262 + fVar165 * fVar69 + fVar171 * fVar89 +
                            fVar212 * fVar179 + fVar226 * fVar187 + fVar219 * fVar205;
              pfVar232[4] = fVar263 * fVar49 + fVar277 + fVar124 * fVar56 + fVar130 * fVar63 +
                            fVar137 * fVar192 + fVar166 * fVar70 + fVar172 * fVar90 +
                            fVar213 * fVar180 + fVar227 * fVar188 + fVar220 * fVar206;
              pfVar232[5] = fVar118 * fVar50 + fVar278 + fVar125 * fVar57 + fVar131 * fVar64 +
                            fVar138 * fVar193 + fVar257 * fVar71 + fVar173 * fVar91 +
                            fVar214 * fVar181 + fVar228 * fVar189 + fVar221 * fVar207;
              pfVar232[6] = fVar119 * fVar51 + fVar279 + fVar126 * fVar58 + fVar132 * fVar65 +
                            fVar139 * fVar194 + fVar167 * fVar72 + fVar174 * fVar92 +
                            fVar215 * fVar182 + fVar229 * fVar190 + fVar222 * fVar208;
              pfVar232[7] = in_register_000012dc + fVar183 + fVar191 + in_register_000013dc;
              iVar240 = iVar240 + 4;
              lVar235 = lVar235 + 0x80;
            } while (iVar240 < (int)uVar13);
            lVar239 = lVar239 + lVar235;
            pfVar231 = (float *)((long)pfVar231 + lVar235);
            pfVar244 = (float *)((long)pfVar244 + lVar235);
            pfVar230 = (float *)((long)pfVar230 + lVar235);
            pfVar234 = (float *)((long)pfVar234 + lVar235);
            pfVar242 = (float *)((long)pfVar242 + lVar235);
            uVar241 = uVar13 & 0xfffffffc;
          }
          if ((int)(uVar241 | 1) < (int)uVar13) {
            lVar235 = 0;
            uVar238 = uVar241;
            do {
              pfVar232 = (float *)((long)pfVar230 + lVar235 + 0x20);
              fVar16 = *pfVar232;
              fVar17 = pfVar232[1];
              fVar18 = pfVar232[2];
              fVar19 = pfVar232[3];
              fVar20 = pfVar232[4];
              fVar21 = pfVar232[5];
              fVar22 = pfVar232[6];
              fVar23 = pfVar232[7];
              pfVar232 = (float *)((long)pfVar230 + lVar235 + 0x40);
              fVar24 = *pfVar232;
              fVar25 = pfVar232[1];
              fVar26 = pfVar232[2];
              fVar27 = pfVar232[3];
              fVar28 = pfVar232[4];
              fVar29 = pfVar232[5];
              fVar30 = pfVar232[6];
              fVar31 = pfVar232[7];
              pfVar7 = (float *)((long)pvVar15 + lVar243);
              fVar32 = *pfVar7;
              fVar33 = pfVar7[1];
              fVar34 = pfVar7[2];
              fVar35 = pfVar7[3];
              fVar36 = pfVar7[4];
              fVar37 = pfVar7[5];
              fVar38 = pfVar7[6];
              pfVar3 = (float *)((long)pvVar15 + lVar243 + 0x20);
              fVar39 = *pfVar3;
              fVar40 = pfVar3[1];
              fVar41 = pfVar3[2];
              fVar42 = pfVar3[3];
              fVar43 = pfVar3[4];
              fVar44 = pfVar3[5];
              fVar45 = pfVar3[6];
              pfVar4 = (float *)((long)pvVar15 + lVar243 + 0x40);
              fVar46 = *pfVar4;
              fVar47 = pfVar4[1];
              fVar48 = pfVar4[2];
              fVar49 = pfVar4[3];
              fVar50 = pfVar4[4];
              fVar51 = pfVar4[5];
              fVar52 = pfVar4[6];
              pfVar232 = (float *)((long)pvVar15 + lVar243 + 0x60);
              fVar53 = *pfVar232;
              fVar54 = pfVar232[1];
              fVar55 = pfVar232[2];
              fVar56 = pfVar232[3];
              fVar57 = pfVar232[4];
              fVar58 = pfVar232[5];
              fVar59 = pfVar232[6];
              fVar60 = pfVar232[7];
              pfVar232 = (float *)((long)pfVar230 + lVar235);
              fVar61 = pfVar232[1];
              fVar62 = pfVar232[2];
              fVar63 = pfVar232[3];
              fVar64 = pfVar232[4];
              fVar65 = pfVar232[5];
              fVar66 = pfVar232[6];
              fVar260 = fVar280 + in_register_000012dc;
              pfVar245 = (float *)((long)pfVar230 + lVar235 + 0x60);
              fVar67 = *pfVar245;
              fVar68 = pfVar245[1];
              fVar69 = pfVar245[2];
              fVar70 = pfVar245[3];
              fVar71 = pfVar245[4];
              fVar72 = pfVar245[5];
              fVar73 = pfVar245[6];
              fVar261 = fVar280 + in_register_000013dc + in_register_0000141c + fVar31;
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0x80);
              fVar74 = *pfVar245;
              fVar75 = pfVar245[1];
              fVar76 = pfVar245[2];
              fVar77 = pfVar245[3];
              fVar78 = pfVar245[4];
              fVar79 = pfVar245[5];
              fVar80 = pfVar245[6];
              fVar81 = pfVar245[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0xa0);
              fVar82 = *pfVar245;
              fVar83 = pfVar245[1];
              fVar84 = pfVar245[2];
              fVar85 = pfVar245[3];
              fVar86 = pfVar245[4];
              fVar87 = pfVar245[5];
              fVar88 = pfVar245[6];
              fVar89 = pfVar245[7];
              pfVar245 = (float *)((long)pfVar244 + lVar235);
              fVar90 = *pfVar245;
              fVar91 = pfVar245[1];
              fVar92 = pfVar245[2];
              fVar93 = pfVar245[3];
              fVar94 = pfVar245[4];
              fVar95 = pfVar245[5];
              fVar96 = pfVar245[6];
              pfVar5 = (float *)((long)pfVar244 + lVar235 + 0x20);
              fVar97 = *pfVar5;
              fVar98 = pfVar5[1];
              fVar99 = pfVar5[2];
              fVar100 = pfVar5[3];
              fVar101 = pfVar5[4];
              fVar102 = pfVar5[5];
              fVar103 = pfVar5[6];
              pfVar6 = (float *)((long)pfVar244 + lVar235 + 0x40);
              fVar104 = *pfVar6;
              fVar105 = pfVar6[1];
              fVar106 = pfVar6[2];
              fVar107 = pfVar6[3];
              fVar108 = pfVar6[4];
              fVar109 = pfVar6[5];
              fVar110 = pfVar6[6];
              pfVar6 = (float *)((long)pfVar244 + lVar235 + 0x60);
              fVar111 = *pfVar6;
              fVar112 = pfVar6[1];
              fVar113 = pfVar6[2];
              fVar114 = pfVar6[3];
              fVar115 = pfVar6[4];
              fVar116 = pfVar6[5];
              fVar117 = pfVar6[6];
              fVar258 = in_register_0000151c + in_register_0000159c + pfVar3[7];
              fVar259 = fVar261 + in_register_0000155c + in_register_0000159c + fVar258;
              fVar262 = pfVar245[7] + fVar280 + pfVar5[7] + fVar261;
              in_register_0000141c = fVar280 + pfVar7[7] + in_register_0000159c + pfVar4[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0xc0);
              fVar261 = *pfVar245;
              fVar263 = pfVar245[1];
              fVar118 = pfVar245[2];
              fVar119 = pfVar245[3];
              fVar120 = pfVar245[4];
              fVar121 = pfVar245[5];
              fVar122 = pfVar245[6];
              in_register_0000135c = pfVar245[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0xe0);
              fVar123 = *pfVar245;
              fVar124 = pfVar245[1];
              fVar125 = pfVar245[2];
              fVar126 = pfVar245[3];
              fVar271 = pfVar245[4];
              fVar127 = pfVar245[5];
              fVar128 = pfVar245[6];
              fVar129 = pfVar245[7];
              pfVar245 = (float *)((long)pfVar231 + lVar235);
              fVar130 = *pfVar245;
              fVar131 = pfVar245[1];
              fVar132 = pfVar245[2];
              fVar133 = pfVar245[3];
              fVar134 = pfVar245[4];
              fVar135 = pfVar245[5];
              fVar136 = pfVar245[6];
              pfVar3 = (float *)((long)pfVar231 + lVar235 + 0x20);
              fVar137 = *pfVar3;
              fVar138 = pfVar3[1];
              fVar139 = pfVar3[2];
              fVar140 = pfVar3[3];
              fVar141 = pfVar3[4];
              fVar142 = pfVar3[5];
              fVar143 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar231 + lVar235 + 0x40);
              fVar178 = *pfVar4;
              fVar179 = pfVar4[1];
              fVar180 = pfVar4[2];
              fVar181 = pfVar4[3];
              fVar182 = pfVar4[4];
              fVar183 = pfVar4[5];
              fVar184 = pfVar4[6];
              in_register_000014dc = pfVar4[7];
              in_register_0000155c =
                   in_register_0000155c + in_register_0000159c + in_register_0000159c;
              in_register_0000145c = pfVar245[7] + pfVar3[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0x100);
              fVar171 = *pfVar245;
              fVar172 = pfVar245[1];
              fVar173 = pfVar245[2];
              fVar174 = pfVar245[3];
              fVar175 = pfVar245[4];
              fVar176 = pfVar245[5];
              fVar177 = pfVar245[6];
              in_register_0000149c = pfVar245[7];
              fVar251 = in_register_0000151c + in_register_0000159c + in_register_0000159c + fVar81;
              pfVar245 = (float *)((long)pfVar231 + lVar235 + 0x60);
              fVar185 = *pfVar245;
              fVar186 = pfVar245[1];
              fVar187 = pfVar245[2];
              fVar188 = pfVar245[3];
              fVar189 = pfVar245[4];
              fVar190 = pfVar245[5];
              fVar191 = pfVar245[6];
              in_register_0000151c = pfVar245[7];
              in_register_000012dc = fVar259 + in_register_0000155c + fVar251;
              in_register_0000139c = fVar262 + in_register_0000145c + fVar259;
              pfVar245 = (float *)(lVar239 + 0x20 + lVar235);
              fVar259 = *pfVar245;
              fVar144 = pfVar245[1];
              fVar145 = pfVar245[2];
              fVar146 = pfVar245[3];
              fVar147 = pfVar245[4];
              fVar148 = pfVar245[5];
              fVar149 = pfVar245[6];
              fVar150 = pfVar245[7];
              pfVar245 = (float *)(lVar239 + lVar235);
              fVar151 = *pfVar245;
              fVar152 = pfVar245[1];
              fVar153 = pfVar245[2];
              fVar154 = pfVar245[3];
              fVar155 = pfVar245[4];
              fVar156 = pfVar245[5];
              fVar157 = pfVar245[6];
              pfVar245 = (float *)(lVar239 + 0x40 + lVar235);
              fVar165 = *pfVar245;
              fVar166 = pfVar245[1];
              fVar257 = pfVar245[2];
              fVar167 = pfVar245[3];
              fVar168 = pfVar245[4];
              fVar169 = pfVar245[5];
              fVar170 = pfVar245[6];
              in_register_000013dc = pfVar245[7];
              pfVar245 = (float *)(lVar239 + 0x60 + lVar235);
              fVar158 = *pfVar245;
              fVar159 = pfVar245[1];
              fVar160 = pfVar245[2];
              fVar161 = pfVar245[3];
              fVar162 = pfVar245[4];
              fVar163 = pfVar245[5];
              fVar164 = pfVar245[6];
              pfVar245 = (float *)((long)pfVar242 + lVar235);
              *pfVar245 = fVar273 + fVar32 * *pfVar232 + fVar16 * fVar39 + fVar24 * fVar46 +
                          fVar90 * fVar53 + fVar97 * fVar74 + fVar104 * fVar82 +
                          fVar130 * fVar261 + fVar137 * fVar123 + fVar178 * fVar171;
              pfVar245[1] = fVar274 + fVar33 * fVar61 + fVar17 * fVar40 + fVar25 * fVar47 +
                            fVar91 * fVar54 + fVar98 * fVar75 + fVar105 * fVar83 +
                            fVar131 * fVar263 + fVar138 * fVar124 + fVar179 * fVar172;
              pfVar245[2] = fVar275 + fVar34 * fVar62 + fVar18 * fVar41 + fVar26 * fVar48 +
                            fVar92 * fVar55 + fVar99 * fVar76 + fVar106 * fVar84 +
                            fVar132 * fVar118 + fVar139 * fVar125 + fVar180 * fVar173;
              pfVar245[3] = fVar276 + fVar35 * fVar63 + fVar19 * fVar42 + fVar27 * fVar49 +
                            fVar93 * fVar56 + fVar100 * fVar77 + fVar107 * fVar85 +
                            fVar133 * fVar119 + fVar140 * fVar126 + fVar181 * fVar174;
              pfVar245[4] = fVar277 + fVar36 * fVar64 + fVar20 * fVar43 + fVar28 * fVar50 +
                            fVar94 * fVar57 + fVar101 * fVar78 + fVar108 * fVar86 +
                            fVar134 * fVar120 + fVar141 * fVar271 + fVar182 * fVar175;
              pfVar245[5] = fVar278 + fVar37 * fVar65 + fVar21 * fVar44 + fVar29 * fVar51 +
                            fVar95 * fVar58 + fVar102 * fVar79 + fVar109 * fVar87 +
                            fVar135 * fVar121 + fVar142 * fVar127 + fVar183 * fVar176;
              pfVar245[6] = fVar279 + fVar38 * fVar66 + fVar22 * fVar45 + fVar30 * fVar52 +
                            fVar96 * fVar59 + fVar103 * fVar80 + fVar110 * fVar88 +
                            fVar136 * fVar122 + fVar143 * fVar128 + fVar184 * fVar177;
              pfVar245[7] = fVar260 + fVar23 + fVar31 + fVar258 + fVar251;
              pfVar232 = (float *)((long)pfVar242 + lVar235 + 0x20);
              *pfVar232 = fVar273 + fVar16 * fVar32 + fVar24 * fVar39 + fVar46 * fVar67 +
                          fVar97 * fVar53 + fVar104 * fVar74 + fVar111 * fVar82 +
                          fVar137 * fVar261 + fVar178 * fVar123 + fVar185 * fVar171;
              pfVar232[1] = fVar274 + fVar17 * fVar33 + fVar25 * fVar40 + fVar47 * fVar68 +
                            fVar98 * fVar54 + fVar105 * fVar75 + fVar112 * fVar83 +
                            fVar138 * fVar263 + fVar179 * fVar124 + fVar186 * fVar172;
              pfVar232[2] = fVar275 + fVar18 * fVar34 + fVar26 * fVar41 + fVar48 * fVar69 +
                            fVar99 * fVar55 + fVar106 * fVar76 + fVar113 * fVar84 +
                            fVar139 * fVar118 + fVar180 * fVar125 + fVar187 * fVar173;
              pfVar232[3] = fVar276 + fVar19 * fVar35 + fVar27 * fVar42 + fVar49 * fVar70 +
                            fVar100 * fVar56 + fVar107 * fVar77 + fVar114 * fVar85 +
                            fVar140 * fVar119 + fVar181 * fVar126 + fVar188 * fVar174;
              pfVar232[4] = fVar277 + fVar20 * fVar36 + fVar28 * fVar43 + fVar50 * fVar71 +
                            fVar101 * fVar57 + fVar108 * fVar78 + fVar115 * fVar86 +
                            fVar141 * fVar120 + fVar182 * fVar271 + fVar189 * fVar175;
              pfVar232[5] = fVar278 + fVar21 * fVar37 + fVar29 * fVar44 + fVar51 * fVar72 +
                            fVar102 * fVar58 + fVar109 * fVar79 + fVar116 * fVar87 +
                            fVar142 * fVar121 + fVar183 * fVar127 + fVar190 * fVar176;
              pfVar232[6] = fVar279 + fVar22 * fVar38 + fVar30 * fVar45 + fVar52 * fVar73 +
                            fVar103 * fVar59 + fVar110 * fVar80 + fVar117 * fVar88 +
                            fVar143 * fVar122 + fVar184 * fVar128 + fVar191 * fVar177;
              pfVar232[7] = in_register_000012dc;
              pfVar232 = (float *)((long)pfVar234 + lVar235);
              *pfVar232 = fVar90 * fVar32 + fVar273 + fVar97 * fVar39 + fVar104 * fVar46 +
                          fVar130 * fVar53 + fVar137 * fVar74 + fVar178 * fVar82 +
                          fVar261 * fVar151 + fVar259 * fVar123 + fVar171 * fVar165;
              pfVar232[1] = fVar91 * fVar33 + fVar274 + fVar98 * fVar40 + fVar105 * fVar47 +
                            fVar131 * fVar54 + fVar138 * fVar75 + fVar179 * fVar83 +
                            fVar263 * fVar152 + fVar144 * fVar124 + fVar172 * fVar166;
              pfVar232[2] = fVar92 * fVar34 + fVar275 + fVar99 * fVar41 + fVar106 * fVar48 +
                            fVar132 * fVar55 + fVar139 * fVar76 + fVar180 * fVar84 +
                            fVar118 * fVar153 + fVar145 * fVar125 + fVar173 * fVar257;
              pfVar232[3] = fVar93 * fVar35 + fVar276 + fVar100 * fVar42 + fVar107 * fVar49 +
                            fVar133 * fVar56 + fVar140 * fVar77 + fVar181 * fVar85 +
                            fVar119 * fVar154 + fVar146 * fVar126 + fVar174 * fVar167;
              pfVar232[4] = fVar94 * fVar36 + fVar277 + fVar101 * fVar43 + fVar108 * fVar50 +
                            fVar134 * fVar57 + fVar141 * fVar78 + fVar182 * fVar86 +
                            fVar120 * fVar155 + fVar147 * fVar271 + fVar175 * fVar168;
              pfVar232[5] = fVar95 * fVar37 + fVar278 + fVar102 * fVar44 + fVar109 * fVar51 +
                            fVar135 * fVar58 + fVar142 * fVar79 + fVar183 * fVar87 +
                            fVar121 * fVar156 + fVar148 * fVar127 + fVar176 * fVar169;
              pfVar232[6] = fVar96 * fVar38 + fVar279 + fVar103 * fVar45 + fVar110 * fVar52 +
                            fVar136 * fVar59 + fVar143 * fVar80 + fVar184 * fVar88 +
                            fVar122 * fVar157 + fVar149 * fVar128 + fVar177 * fVar170;
              pfVar232[7] = in_register_0000139c + fVar262 + fVar150 + in_register_0000135c;
              pfVar232 = (float *)((long)pfVar234 + lVar235 + 0x20);
              *pfVar232 = fVar273 + fVar97 * fVar32 + fVar104 * fVar39 + fVar111 * fVar46 +
                          fVar137 * fVar53 + fVar178 * fVar74 + fVar185 * fVar82 +
                          fVar259 * fVar261 + fVar165 * fVar123 + fVar171 * fVar158;
              pfVar232[1] = fVar274 + fVar98 * fVar33 + fVar105 * fVar40 + fVar112 * fVar47 +
                            fVar138 * fVar54 + fVar179 * fVar75 + fVar186 * fVar83 +
                            fVar144 * fVar263 + fVar166 * fVar124 + fVar172 * fVar159;
              pfVar232[2] = fVar275 + fVar99 * fVar34 + fVar106 * fVar41 + fVar113 * fVar48 +
                            fVar139 * fVar55 + fVar180 * fVar76 + fVar187 * fVar84 +
                            fVar145 * fVar118 + fVar257 * fVar125 + fVar173 * fVar160;
              pfVar232[3] = fVar276 + fVar100 * fVar35 + fVar107 * fVar42 + fVar114 * fVar49 +
                            fVar140 * fVar56 + fVar181 * fVar77 + fVar188 * fVar85 +
                            fVar146 * fVar119 + fVar167 * fVar126 + fVar174 * fVar161;
              pfVar232[4] = fVar277 + fVar101 * fVar36 + fVar108 * fVar43 + fVar115 * fVar50 +
                            fVar141 * fVar57 + fVar182 * fVar78 + fVar189 * fVar86 +
                            fVar147 * fVar120 + fVar168 * fVar271 + fVar175 * fVar162;
              pfVar232[5] = fVar278 + fVar102 * fVar37 + fVar109 * fVar44 + fVar116 * fVar51 +
                            fVar142 * fVar58 + fVar183 * fVar79 + fVar190 * fVar87 +
                            fVar148 * fVar121 + fVar169 * fVar127 + fVar176 * fVar163;
              pfVar232[6] = fVar279 + fVar103 * fVar38 + fVar110 * fVar45 + fVar117 * fVar52 +
                            fVar143 * fVar59 + fVar184 * fVar80 + fVar191 * fVar88 +
                            fVar149 * fVar122 + fVar170 * fVar128 + fVar177 * fVar164;
              pfVar232[7] = in_register_0000141c + fVar60 + fVar81 + fVar89 +
                            in_register_0000135c + fVar129 + in_register_0000135c;
              uVar241 = uVar238 + 2;
              iVar240 = uVar238 + 3;
              lVar235 = lVar235 + 0x40;
              uVar238 = uVar241;
            } while (iVar240 < (int)uVar13);
            lVar239 = lVar239 + lVar235;
            pfVar231 = (float *)((long)pfVar231 + lVar235);
            pfVar244 = (float *)((long)pfVar244 + lVar235);
            pfVar230 = (float *)((long)pfVar230 + lVar235);
            pfVar234 = (float *)((long)pfVar234 + lVar235);
            pfVar242 = (float *)((long)pfVar242 + lVar235);
          }
          if ((int)uVar241 < (int)uVar13) {
            iVar240 = uVar13 - uVar241;
            lVar235 = 0;
            do {
              pfVar232 = (float *)((long)pvVar15 + lVar243);
              fVar16 = *pfVar232;
              fVar17 = pfVar232[1];
              fVar18 = pfVar232[2];
              fVar19 = pfVar232[3];
              fVar20 = pfVar232[4];
              fVar21 = pfVar232[5];
              fVar22 = pfVar232[6];
              fVar23 = pfVar232[7];
              pfVar232 = (float *)((long)pvVar15 + lVar243 + 0x20);
              fVar24 = *pfVar232;
              fVar25 = pfVar232[1];
              fVar26 = pfVar232[2];
              fVar27 = pfVar232[3];
              fVar28 = pfVar232[4];
              fVar29 = pfVar232[5];
              fVar30 = pfVar232[6];
              fVar31 = pfVar232[7];
              pfVar232 = (float *)((long)pvVar15 + lVar243 + 0x40);
              fVar32 = *pfVar232;
              fVar33 = pfVar232[1];
              fVar34 = pfVar232[2];
              fVar35 = pfVar232[3];
              fVar36 = pfVar232[4];
              fVar37 = pfVar232[5];
              fVar38 = pfVar232[6];
              fVar39 = pfVar232[7];
              pfVar232 = (float *)((long)pfVar230 + lVar235);
              fVar40 = pfVar232[1];
              fVar41 = pfVar232[2];
              fVar42 = pfVar232[3];
              fVar43 = pfVar232[4];
              fVar44 = pfVar232[5];
              fVar45 = pfVar232[6];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0x60);
              fVar46 = *pfVar245;
              fVar47 = pfVar245[1];
              fVar48 = pfVar245[2];
              fVar49 = pfVar245[3];
              fVar50 = pfVar245[4];
              fVar51 = pfVar245[5];
              fVar52 = pfVar245[6];
              fVar53 = pfVar245[7];
              pfVar3 = (float *)((long)pfVar230 + lVar235 + 0x20);
              fVar54 = pfVar3[1];
              fVar55 = pfVar3[2];
              fVar56 = pfVar3[3];
              fVar57 = pfVar3[4];
              fVar58 = pfVar3[5];
              fVar59 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar230 + lVar235 + 0x40);
              fVar60 = pfVar4[1];
              fVar61 = pfVar4[2];
              fVar62 = pfVar4[3];
              fVar63 = pfVar4[4];
              fVar64 = pfVar4[5];
              fVar65 = pfVar4[6];
              fVar261 = in_register_0000135c + in_register_0000139c;
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0x80);
              fVar66 = *pfVar245;
              fVar67 = pfVar245[1];
              fVar68 = pfVar245[2];
              fVar69 = pfVar245[3];
              fVar70 = pfVar245[4];
              fVar71 = pfVar245[5];
              fVar72 = pfVar245[6];
              fVar73 = pfVar245[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0xa0);
              fVar136 = *pfVar245;
              fVar137 = pfVar245[1];
              fVar138 = pfVar245[2];
              fVar139 = pfVar245[3];
              fVar140 = pfVar245[4];
              fVar141 = pfVar245[5];
              fVar142 = pfVar245[6];
              in_register_0000139c = pfVar245[7];
              pfVar245 = (float *)((long)pfVar244 + lVar235);
              fVar74 = *pfVar245;
              fVar75 = pfVar245[1];
              fVar76 = pfVar245[2];
              fVar77 = pfVar245[3];
              fVar78 = pfVar245[4];
              fVar79 = pfVar245[5];
              fVar80 = pfVar245[6];
              pfVar5 = (float *)((long)pfVar244 + lVar235 + 0x20);
              fVar81 = *pfVar5;
              fVar82 = pfVar5[1];
              fVar83 = pfVar5[2];
              fVar84 = pfVar5[3];
              fVar85 = pfVar5[4];
              fVar86 = pfVar5[5];
              fVar87 = pfVar5[6];
              pfVar6 = (float *)((long)pfVar244 + lVar235 + 0x40);
              fVar88 = *pfVar6;
              fVar89 = pfVar6[1];
              fVar90 = pfVar6[2];
              fVar91 = pfVar6[3];
              fVar92 = pfVar6[4];
              fVar93 = pfVar6[5];
              fVar94 = pfVar6[6];
              fVar263 = in_register_0000149c + pfVar245[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0xc0);
              fVar95 = *pfVar245;
              fVar96 = pfVar245[1];
              fVar97 = pfVar245[2];
              fVar98 = pfVar245[3];
              fVar99 = pfVar245[4];
              fVar100 = pfVar245[5];
              fVar101 = pfVar245[6];
              fVar102 = pfVar245[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0xe0);
              fVar103 = *pfVar245;
              fVar104 = pfVar245[1];
              fVar105 = pfVar245[2];
              fVar106 = pfVar245[3];
              fVar107 = pfVar245[4];
              fVar108 = pfVar245[5];
              fVar109 = pfVar245[6];
              fVar110 = pfVar245[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0x100);
              fVar143 = *pfVar245;
              fVar259 = pfVar245[1];
              fVar144 = pfVar245[2];
              fVar145 = pfVar245[3];
              fVar146 = pfVar245[4];
              fVar147 = pfVar245[5];
              fVar148 = pfVar245[6];
              in_register_000013dc = pfVar245[7];
              pfVar245 = (float *)((long)pfVar231 + lVar235);
              fVar111 = *pfVar245;
              fVar112 = pfVar245[1];
              fVar113 = pfVar245[2];
              fVar114 = pfVar245[3];
              fVar115 = pfVar245[4];
              fVar116 = pfVar245[5];
              fVar117 = pfVar245[6];
              pfVar6 = (float *)((long)pfVar231 + lVar235 + 0x20);
              fVar149 = *pfVar6;
              fVar150 = pfVar6[1];
              fVar151 = pfVar6[2];
              fVar152 = pfVar6[3];
              fVar153 = pfVar6[4];
              fVar154 = pfVar6[5];
              fVar155 = pfVar6[6];
              in_register_0000145c = pfVar6[7];
              pfVar6 = (float *)((long)pfVar231 + lVar235 + 0x40);
              fVar156 = *pfVar6;
              fVar157 = pfVar6[1];
              fVar158 = pfVar6[2];
              fVar159 = pfVar6[3];
              fVar160 = pfVar6[4];
              fVar161 = pfVar6[5];
              fVar162 = pfVar6[6];
              in_register_0000149c = pfVar6[7];
              in_register_0000141c = in_register_000014dc + pfVar245[7];
              in_register_0000135c = in_register_0000141c + fVar73;
              in_register_000012dc =
                   fVar280 + in_register_000012dc + fVar261 + pfVar5[7] + fVar263 +
                   in_register_0000135c;
              pfVar245 = (float *)(lVar239 + lVar235);
              fVar261 = *pfVar245;
              fVar263 = pfVar245[1];
              fVar118 = pfVar245[2];
              fVar119 = pfVar245[3];
              fVar120 = pfVar245[4];
              fVar121 = pfVar245[5];
              fVar122 = pfVar245[6];
              pfVar245 = (float *)(lVar239 + 0x20 + lVar235);
              fVar123 = *pfVar245;
              fVar124 = pfVar245[1];
              fVar125 = pfVar245[2];
              fVar126 = pfVar245[3];
              fVar271 = pfVar245[4];
              fVar127 = pfVar245[5];
              fVar128 = pfVar245[6];
              pfVar245 = (float *)(lVar239 + 0x40 + lVar235);
              fVar129 = *pfVar245;
              fVar130 = pfVar245[1];
              fVar131 = pfVar245[2];
              fVar132 = pfVar245[3];
              fVar133 = pfVar245[4];
              fVar134 = pfVar245[5];
              fVar135 = pfVar245[6];
              pfVar245 = (float *)((long)pfVar242 + lVar235);
              *pfVar245 = fVar273 + fVar16 * *pfVar232 + fVar24 * *pfVar3 + fVar32 * *pfVar4 +
                          fVar88 * fVar136 + fVar74 * fVar46 + fVar81 * fVar66 +
                          fVar111 * fVar95 + fVar149 * fVar103 + fVar156 * fVar143;
              pfVar245[1] = fVar274 + fVar17 * fVar40 + fVar25 * fVar54 + fVar33 * fVar60 +
                            fVar89 * fVar137 + fVar75 * fVar47 + fVar82 * fVar67 +
                            fVar112 * fVar96 + fVar150 * fVar104 + fVar157 * fVar259;
              pfVar245[2] = fVar275 + fVar18 * fVar41 + fVar26 * fVar55 + fVar34 * fVar61 +
                            fVar90 * fVar138 + fVar76 * fVar48 + fVar83 * fVar68 +
                            fVar113 * fVar97 + fVar151 * fVar105 + fVar158 * fVar144;
              pfVar245[3] = fVar276 + fVar19 * fVar42 + fVar27 * fVar56 + fVar35 * fVar62 +
                            fVar91 * fVar139 + fVar77 * fVar49 + fVar84 * fVar69 +
                            fVar114 * fVar98 + fVar152 * fVar106 + fVar159 * fVar145;
              pfVar245[4] = fVar277 + fVar20 * fVar43 + fVar28 * fVar57 + fVar36 * fVar63 +
                            fVar92 * fVar140 + fVar78 * fVar50 + fVar85 * fVar70 +
                            fVar115 * fVar99 + fVar153 * fVar107 + fVar160 * fVar146;
              pfVar245[5] = fVar278 + fVar21 * fVar44 + fVar29 * fVar58 + fVar37 * fVar64 +
                            fVar93 * fVar141 + fVar79 * fVar51 + fVar86 * fVar71 +
                            fVar116 * fVar100 + fVar154 * fVar108 + fVar161 * fVar147;
              pfVar245[6] = fVar279 + fVar22 * fVar45 + fVar30 * fVar59 + fVar38 * fVar65 +
                            fVar94 * fVar142 + fVar80 * fVar52 + fVar87 * fVar72 +
                            fVar117 * fVar101 + fVar155 * fVar109 + fVar162 * fVar148;
              pfVar245[7] = in_register_000012dc;
              pfVar232 = (float *)((long)pfVar234 + lVar235);
              *pfVar232 = fVar273 + fVar74 * fVar16 + fVar81 * fVar24 + fVar88 * fVar32 +
                          fVar111 * fVar46 + fVar149 * fVar66 + fVar156 * fVar136 +
                          fVar95 * fVar261 + fVar103 * fVar123 + fVar143 * fVar129;
              pfVar232[1] = fVar274 + fVar75 * fVar17 + fVar82 * fVar25 + fVar89 * fVar33 +
                            fVar112 * fVar47 + fVar150 * fVar67 + fVar157 * fVar137 +
                            fVar96 * fVar263 + fVar104 * fVar124 + fVar259 * fVar130;
              pfVar232[2] = fVar275 + fVar76 * fVar18 + fVar83 * fVar26 + fVar90 * fVar34 +
                            fVar113 * fVar48 + fVar151 * fVar68 + fVar158 * fVar138 +
                            fVar97 * fVar118 + fVar105 * fVar125 + fVar144 * fVar131;
              pfVar232[3] = fVar276 + fVar77 * fVar19 + fVar84 * fVar27 + fVar91 * fVar35 +
                            fVar114 * fVar49 + fVar152 * fVar69 + fVar159 * fVar139 +
                            fVar98 * fVar119 + fVar106 * fVar126 + fVar145 * fVar132;
              pfVar232[4] = fVar277 + fVar78 * fVar20 + fVar85 * fVar28 + fVar92 * fVar36 +
                            fVar115 * fVar50 + fVar153 * fVar70 + fVar160 * fVar140 +
                            fVar99 * fVar120 + fVar107 * fVar271 + fVar146 * fVar133;
              pfVar232[5] = fVar278 + fVar79 * fVar21 + fVar86 * fVar29 + fVar93 * fVar37 +
                            fVar116 * fVar51 + fVar154 * fVar71 + fVar161 * fVar141 +
                            fVar100 * fVar121 + fVar108 * fVar127 + fVar147 * fVar134;
              pfVar232[6] = fVar279 + fVar80 * fVar22 + fVar87 * fVar30 + fVar94 * fVar38 +
                            fVar117 * fVar52 + fVar155 * fVar72 + fVar162 * fVar142 +
                            fVar101 * fVar122 + fVar109 * fVar128 + fVar148 * fVar135;
              pfVar232[7] = fVar280 + fVar23 + fVar31 + fVar39 +
                            fVar53 + fVar73 + in_register_0000135c + fVar102 + fVar110 + fVar110;
              lVar235 = lVar235 + 0x20;
              iVar240 = iVar240 + -1;
            } while (iVar240 != 0);
            lVar239 = lVar239 + lVar235;
            pfVar231 = (float *)((long)pfVar231 + lVar235);
            pfVar244 = (float *)((long)pfVar244 + lVar235);
            pfVar230 = (float *)((long)pfVar230 + lVar235);
            pfVar234 = (float *)((long)pfVar234 + lVar235);
            pfVar242 = (float *)((long)pfVar242 + lVar235);
          }
          pfVar230 = pfVar230 + lVar2;
          pfVar244 = pfVar244 + lVar2;
          pfVar231 = pfVar231 + lVar2;
          lVar239 = lVar239 + lVar2 * 4;
          pfVar242 = pfVar242 + (long)(int)uVar13 * 8;
          pfVar234 = pfVar234 + (long)(int)uVar13 * 8;
          iVar240 = iVar233 + 3;
          uVar241 = uVar14 & 0xfffffffe;
          iVar233 = iVar233 + 2;
        } while (iVar240 < (int)uVar14);
      }
      if ((int)uVar241 < (int)uVar14) {
        do {
          uVar238 = 0;
          if (3 < (int)uVar13) {
            iVar233 = 3;
            do {
              fVar16 = pfVar230[8];
              fVar17 = pfVar230[9];
              fVar18 = pfVar230[10];
              fVar19 = pfVar230[0xb];
              fVar20 = pfVar230[0xc];
              fVar21 = pfVar230[0xd];
              fVar22 = pfVar230[0xe];
              pfVar3 = pfVar230 + 0xf;
              fVar23 = pfVar230[0x10];
              fVar24 = pfVar230[0x11];
              fVar25 = pfVar230[0x12];
              fVar26 = pfVar230[0x13];
              fVar27 = pfVar230[0x14];
              fVar28 = pfVar230[0x15];
              fVar29 = pfVar230[0x16];
              pfVar4 = pfVar230 + 0x17;
              fVar30 = pfVar230[0x18];
              fVar31 = pfVar230[0x19];
              fVar32 = pfVar230[0x1a];
              fVar33 = pfVar230[0x1b];
              fVar34 = pfVar230[0x1c];
              fVar35 = pfVar230[0x1d];
              fVar36 = pfVar230[0x1e];
              pfVar5 = pfVar230 + 0x1f;
              pfVar245 = (float *)((long)pvVar15 + lVar243);
              fVar37 = *pfVar245;
              fVar38 = pfVar245[1];
              fVar39 = pfVar245[2];
              fVar40 = pfVar245[3];
              fVar41 = pfVar245[4];
              fVar42 = pfVar245[5];
              fVar43 = pfVar245[6];
              pfVar234 = (float *)((long)pvVar15 + lVar243 + 0x40);
              fVar44 = *pfVar234;
              fVar45 = pfVar234[1];
              fVar46 = pfVar234[2];
              fVar47 = pfVar234[3];
              fVar48 = pfVar234[4];
              fVar49 = pfVar234[5];
              fVar50 = pfVar234[6];
              fVar51 = pfVar234[7];
              fVar52 = *pfVar230;
              fVar53 = pfVar230[1];
              fVar54 = pfVar230[2];
              fVar55 = pfVar230[3];
              fVar56 = pfVar230[4];
              fVar57 = pfVar230[5];
              fVar58 = pfVar230[6];
              fVar59 = pfVar230[0x28];
              fVar60 = pfVar230[0x29];
              fVar61 = pfVar230[0x2a];
              fVar62 = pfVar230[0x2b];
              fVar63 = pfVar230[0x2c];
              fVar64 = pfVar230[0x2d];
              fVar65 = pfVar230[0x2e];
              fVar66 = pfVar230[0x20];
              fVar67 = pfVar230[0x21];
              fVar68 = pfVar230[0x22];
              fVar69 = pfVar230[0x23];
              fVar70 = pfVar230[0x24];
              fVar71 = pfVar230[0x25];
              fVar72 = pfVar230[0x26];
              pfVar230 = pfVar230 + 0x20;
              pfVar234 = (float *)((long)pvVar15 + lVar243 + 0x20);
              fVar73 = *pfVar234;
              fVar74 = pfVar234[1];
              fVar75 = pfVar234[2];
              fVar76 = pfVar234[3];
              fVar77 = pfVar234[4];
              fVar78 = pfVar234[5];
              fVar79 = pfVar234[6];
              pfVar232 = (float *)((long)pvVar15 + lVar243 + 0x60);
              fVar80 = *pfVar232;
              fVar81 = pfVar232[1];
              fVar82 = pfVar232[2];
              fVar83 = pfVar232[3];
              fVar84 = pfVar232[4];
              fVar85 = pfVar232[5];
              fVar86 = pfVar232[6];
              fVar87 = pfVar232[7];
              fVar266 = in_register_0000149c + fVar280;
              fVar269 = in_register_000014dc + fVar280;
              fVar253 = fVar280 + in_register_0000139c + *pfVar3 + *pfVar4;
              fVar255 = in_register_0000151c + *pfVar5;
              fVar256 = pfVar234[7] + in_register_000013dc;
              pfVar234 = (float *)((long)pvVar15 + lVar243 + 0x80);
              fVar88 = *pfVar234;
              fVar89 = pfVar234[1];
              fVar90 = pfVar234[2];
              fVar91 = pfVar234[3];
              fVar92 = pfVar234[4];
              fVar93 = pfVar234[5];
              fVar94 = pfVar234[6];
              pfVar232 = (float *)((long)pvVar15 + lVar243 + 0xa0);
              fVar95 = *pfVar232;
              fVar96 = pfVar232[1];
              fVar97 = pfVar232[2];
              fVar98 = pfVar232[3];
              fVar99 = pfVar232[4];
              fVar100 = pfVar232[5];
              fVar101 = pfVar232[6];
              fVar102 = pfVar244[8];
              fVar103 = pfVar244[9];
              fVar104 = pfVar244[10];
              fVar105 = pfVar244[0xb];
              fVar106 = pfVar244[0xc];
              fVar107 = pfVar244[0xd];
              fVar108 = pfVar244[0xe];
              fVar109 = pfVar244[0xf];
              fVar110 = pfVar244[0x10];
              fVar111 = pfVar244[0x11];
              fVar112 = pfVar244[0x12];
              fVar113 = pfVar244[0x13];
              fVar114 = pfVar244[0x14];
              fVar115 = pfVar244[0x15];
              fVar116 = pfVar244[0x16];
              fVar117 = pfVar244[0x18];
              fVar261 = pfVar244[0x19];
              fVar263 = pfVar244[0x1a];
              fVar118 = pfVar244[0x1b];
              fVar119 = pfVar244[0x1c];
              fVar120 = pfVar244[0x1d];
              fVar121 = pfVar244[0x1e];
              fVar122 = pfVar244[0x20];
              fVar123 = pfVar244[0x21];
              fVar124 = pfVar244[0x22];
              fVar125 = pfVar244[0x23];
              fVar126 = pfVar244[0x24];
              fVar271 = pfVar244[0x25];
              fVar127 = pfVar244[0x26];
              fVar128 = pfVar244[0x27];
              fVar129 = *pfVar244;
              fVar130 = pfVar244[1];
              fVar131 = pfVar244[2];
              fVar132 = pfVar244[3];
              fVar133 = pfVar244[4];
              fVar134 = pfVar244[5];
              fVar135 = pfVar244[6];
              fVar270 = in_register_0000151c + fVar269;
              fVar272 = in_register_0000155c + in_register_0000151c;
              fVar136 = pfVar244[0x28];
              fVar137 = pfVar244[0x29];
              fVar138 = pfVar244[0x2a];
              fVar139 = pfVar244[0x2b];
              fVar140 = pfVar244[0x2c];
              fVar141 = pfVar244[0x2d];
              fVar142 = pfVar244[0x2e];
              pfVar244 = pfVar244 + 0x20;
              pfVar232 = (float *)((long)pvVar15 + lVar243 + 0xc0);
              fVar143 = *pfVar232;
              fVar259 = pfVar232[1];
              fVar144 = pfVar232[2];
              fVar145 = pfVar232[3];
              fVar146 = pfVar232[4];
              fVar147 = pfVar232[5];
              fVar148 = pfVar232[6];
              pfVar3 = (float *)((long)pvVar15 + lVar243 + 0xe0);
              fVar149 = *pfVar3;
              fVar150 = pfVar3[1];
              fVar151 = pfVar3[2];
              fVar152 = pfVar3[3];
              fVar153 = pfVar3[4];
              fVar154 = pfVar3[5];
              fVar155 = pfVar3[6];
              pfVar4 = (float *)((long)pvVar15 + lVar243 + 0x100);
              fVar184 = *pfVar4;
              fVar185 = pfVar4[1];
              fVar186 = pfVar4[2];
              fVar187 = pfVar4[3];
              fVar188 = pfVar4[4];
              fVar189 = pfVar4[5];
              fVar190 = pfVar4[6];
              in_register_0000135c = pfVar4[7];
              fVar156 = pfVar231[8];
              fVar157 = pfVar231[9];
              fVar158 = pfVar231[10];
              fVar159 = pfVar231[0xb];
              fVar160 = pfVar231[0xc];
              fVar161 = pfVar231[0xd];
              fVar162 = pfVar231[0xe];
              fVar191 = pfVar231[0x10];
              fVar260 = pfVar231[0x11];
              fVar251 = pfVar231[0x12];
              fVar258 = pfVar231[0x13];
              fVar262 = pfVar231[0x14];
              fVar192 = pfVar231[0x15];
              fVar193 = pfVar231[0x16];
              in_register_0000145c = pfVar231[0x17];
              fVar194 = pfVar231[0x18];
              fVar246 = pfVar231[0x19];
              fVar247 = pfVar231[0x1a];
              fVar249 = pfVar231[0x1b];
              fVar250 = pfVar231[0x1c];
              fVar252 = pfVar231[0x1d];
              fVar254 = pfVar231[0x1e];
              in_register_0000149c = pfVar231[0x1f];
              fVar163 = pfVar231[0x20];
              fVar164 = pfVar231[0x21];
              fVar165 = pfVar231[0x22];
              fVar166 = pfVar231[0x23];
              fVar257 = pfVar231[0x24];
              fVar167 = pfVar231[0x25];
              fVar168 = pfVar231[0x26];
              fVar169 = pfVar231[0x27];
              fVar170 = *pfVar231;
              fVar171 = pfVar231[1];
              fVar172 = pfVar231[2];
              fVar173 = pfVar231[3];
              fVar174 = pfVar231[4];
              fVar175 = pfVar231[5];
              fVar176 = pfVar231[6];
              in_register_0000141c = fVar270 + pfVar231[0xf];
              in_register_000014dc = fVar272 + fVar270;
              in_register_0000151c = in_register_0000155c + fVar272;
              fVar177 = pfVar231[0x28];
              fVar178 = pfVar231[0x29];
              fVar179 = pfVar231[0x2a];
              fVar180 = pfVar231[0x2b];
              fVar181 = pfVar231[0x2c];
              fVar182 = pfVar231[0x2d];
              fVar183 = pfVar231[0x2e];
              pfVar231 = pfVar231 + 0x20;
              in_register_0000139c = pfVar232[7] + pfVar3[7];
              fVar264 = in_register_0000141c + pfVar3[7];
              in_register_000013dc = in_register_000014dc + fVar264;
              in_register_000012dc =
                   fVar280 + pfVar245[7] + fVar256 + in_register_0000155c + fVar87 + pfVar234[7] +
                   in_register_0000155c + in_register_0000139c;
              *pfVar242 = fVar273 + fVar37 * fVar52 + fVar73 * fVar16 + fVar23 * fVar44 +
                          fVar80 * fVar129 + fVar102 * fVar88 + fVar110 * fVar95 +
                          fVar143 * fVar170 + fVar156 * fVar149 + fVar191 * fVar184;
              pfVar242[1] = fVar274 + fVar38 * fVar53 + fVar74 * fVar17 + fVar24 * fVar45 +
                            fVar81 * fVar130 + fVar103 * fVar89 + fVar111 * fVar96 +
                            fVar259 * fVar171 + fVar157 * fVar150 + fVar260 * fVar185;
              pfVar242[2] = fVar275 + fVar39 * fVar54 + fVar75 * fVar18 + fVar25 * fVar46 +
                            fVar82 * fVar131 + fVar104 * fVar90 + fVar112 * fVar97 +
                            fVar144 * fVar172 + fVar158 * fVar151 + fVar251 * fVar186;
              pfVar242[3] = fVar276 + fVar40 * fVar55 + fVar76 * fVar19 + fVar26 * fVar47 +
                            fVar83 * fVar132 + fVar105 * fVar91 + fVar113 * fVar98 +
                            fVar145 * fVar173 + fVar159 * fVar152 + fVar258 * fVar187;
              pfVar242[4] = fVar277 + fVar41 * fVar56 + fVar77 * fVar20 + fVar27 * fVar48 +
                            fVar84 * fVar133 + fVar106 * fVar92 + fVar114 * fVar99 +
                            fVar146 * fVar174 + fVar160 * fVar153 + fVar262 * fVar188;
              pfVar242[5] = fVar278 + fVar42 * fVar57 + fVar78 * fVar21 + fVar28 * fVar49 +
                            fVar85 * fVar134 + fVar107 * fVar93 + fVar115 * fVar100 +
                            fVar147 * fVar175 + fVar161 * fVar154 + fVar192 * fVar189;
              pfVar242[6] = fVar279 + fVar43 * fVar58 + fVar79 * fVar22 + fVar29 * fVar50 +
                            fVar86 * fVar135 + fVar108 * fVar94 + fVar116 * fVar101 +
                            fVar148 * fVar176 + fVar162 * fVar155 + fVar193 * fVar190;
              pfVar242[7] = fVar253 + fVar269 + fVar109 + fVar87 + fVar264;
              pfVar242[8] = fVar16 * fVar37 + fVar273 + fVar73 * fVar23 + fVar30 * fVar44 +
                            fVar102 * fVar80 + fVar110 * fVar88 + fVar117 * fVar95 +
                            fVar156 * fVar143 + fVar191 * fVar149 + fVar194 * fVar184;
              pfVar242[9] = fVar17 * fVar38 + fVar274 + fVar74 * fVar24 + fVar31 * fVar45 +
                            fVar103 * fVar81 + fVar111 * fVar89 + fVar261 * fVar96 +
                            fVar157 * fVar259 + fVar260 * fVar150 + fVar246 * fVar185;
              pfVar242[10] = fVar18 * fVar39 + fVar275 + fVar75 * fVar25 + fVar32 * fVar46 +
                             fVar104 * fVar82 + fVar112 * fVar90 + fVar263 * fVar97 +
                             fVar158 * fVar144 + fVar251 * fVar151 + fVar247 * fVar186;
              pfVar242[0xb] =
                   fVar19 * fVar40 + fVar276 + fVar76 * fVar26 + fVar33 * fVar47 +
                   fVar105 * fVar83 + fVar113 * fVar91 + fVar118 * fVar98 +
                   fVar159 * fVar145 + fVar258 * fVar152 + fVar249 * fVar187;
              pfVar242[0xc] =
                   fVar20 * fVar41 + fVar277 + fVar77 * fVar27 + fVar34 * fVar48 +
                   fVar106 * fVar84 + fVar114 * fVar92 + fVar119 * fVar99 +
                   fVar160 * fVar146 + fVar262 * fVar153 + fVar250 * fVar188;
              pfVar242[0xd] =
                   fVar21 * fVar42 + fVar278 + fVar78 * fVar28 + fVar35 * fVar49 +
                   fVar107 * fVar85 + fVar115 * fVar93 + fVar120 * fVar100 +
                   fVar161 * fVar147 + fVar192 * fVar154 + fVar252 * fVar189;
              pfVar242[0xe] =
                   fVar22 * fVar43 + fVar279 + fVar79 * fVar29 + fVar36 * fVar50 +
                   fVar108 * fVar86 + fVar116 * fVar94 + fVar121 * fVar101 +
                   fVar162 * fVar148 + fVar193 * fVar155 + fVar254 * fVar190;
              pfVar242[0xf] = fVar266 + fVar255 + fVar270 + fVar253 + in_register_000013dc;
              pfVar242[0x10] =
                   fVar23 * fVar37 + fVar273 + fVar73 * fVar30 + fVar66 * fVar44 +
                   fVar110 * fVar80 + fVar117 * fVar88 + fVar122 * fVar95 +
                   fVar191 * fVar143 + fVar194 * fVar149 + fVar163 * fVar184;
              pfVar242[0x11] =
                   fVar24 * fVar38 + fVar274 + fVar74 * fVar31 + fVar67 * fVar45 +
                   fVar111 * fVar81 + fVar261 * fVar89 + fVar123 * fVar96 +
                   fVar260 * fVar259 + fVar246 * fVar150 + fVar164 * fVar185;
              pfVar242[0x12] =
                   fVar25 * fVar39 + fVar275 + fVar75 * fVar32 + fVar68 * fVar46 +
                   fVar112 * fVar82 + fVar263 * fVar90 + fVar124 * fVar97 +
                   fVar251 * fVar144 + fVar247 * fVar151 + fVar165 * fVar186;
              pfVar242[0x13] =
                   fVar26 * fVar40 + fVar276 + fVar76 * fVar33 + fVar69 * fVar47 +
                   fVar113 * fVar83 + fVar118 * fVar91 + fVar125 * fVar98 +
                   fVar258 * fVar145 + fVar249 * fVar152 + fVar166 * fVar187;
              pfVar242[0x14] =
                   fVar27 * fVar41 + fVar277 + fVar77 * fVar34 + fVar70 * fVar48 +
                   fVar114 * fVar84 + fVar119 * fVar92 + fVar126 * fVar99 +
                   fVar262 * fVar146 + fVar250 * fVar153 + fVar257 * fVar188;
              pfVar242[0x15] =
                   fVar28 * fVar42 + fVar278 + fVar78 * fVar35 + fVar71 * fVar49 +
                   fVar115 * fVar85 + fVar120 * fVar93 + fVar271 * fVar100 +
                   fVar192 * fVar147 + fVar252 * fVar154 + fVar167 * fVar189;
              pfVar242[0x16] =
                   fVar29 * fVar43 + fVar279 + fVar79 * fVar36 + fVar72 * fVar50 +
                   fVar116 * fVar86 + fVar121 * fVar94 + fVar127 * fVar101 +
                   fVar193 * fVar148 + fVar254 * fVar155 + fVar168 * fVar190;
              pfVar242[0x17] =
                   fVar269 + in_register_0000155c + fVar51 + fVar272 + fVar128 +
                   in_register_0000151c + fVar169;
              pfVar242[0x18] =
                   fVar273 + fVar30 * fVar37 + fVar66 * fVar73 + fVar44 * fVar59 +
                   fVar95 * fVar136 + fVar117 * fVar80 + fVar122 * fVar88 +
                   fVar184 * fVar177 + fVar194 * fVar143 + fVar163 * fVar149;
              pfVar242[0x19] =
                   fVar274 + fVar31 * fVar38 + fVar67 * fVar74 + fVar45 * fVar60 +
                   fVar96 * fVar137 + fVar261 * fVar81 + fVar123 * fVar89 +
                   fVar185 * fVar178 + fVar246 * fVar259 + fVar164 * fVar150;
              pfVar242[0x1a] =
                   fVar275 + fVar32 * fVar39 + fVar68 * fVar75 + fVar46 * fVar61 +
                   fVar97 * fVar138 + fVar263 * fVar82 + fVar124 * fVar90 +
                   fVar186 * fVar179 + fVar247 * fVar144 + fVar165 * fVar151;
              pfVar242[0x1b] =
                   fVar276 + fVar33 * fVar40 + fVar69 * fVar76 + fVar47 * fVar62 +
                   fVar98 * fVar139 + fVar118 * fVar83 + fVar125 * fVar91 +
                   fVar187 * fVar180 + fVar249 * fVar145 + fVar166 * fVar152;
              pfVar242[0x1c] =
                   fVar277 + fVar34 * fVar41 + fVar70 * fVar77 + fVar48 * fVar63 +
                   fVar99 * fVar140 + fVar119 * fVar84 + fVar126 * fVar92 +
                   fVar188 * fVar181 + fVar250 * fVar146 + fVar257 * fVar153;
              pfVar242[0x1d] =
                   fVar278 + fVar35 * fVar42 + fVar71 * fVar78 + fVar49 * fVar64 +
                   fVar100 * fVar141 + fVar120 * fVar85 + fVar271 * fVar93 +
                   fVar189 * fVar182 + fVar252 * fVar147 + fVar167 * fVar154;
              pfVar242[0x1e] =
                   fVar279 + fVar36 * fVar43 + fVar72 * fVar79 + fVar50 * fVar65 +
                   fVar101 * fVar142 + fVar121 * fVar86 + fVar127 * fVar94 +
                   fVar190 * fVar183 + fVar254 * fVar148 + fVar168 * fVar155;
              pfVar242[0x1f] = in_register_000012dc;
              pfVar242 = pfVar242 + 0x20;
              iVar233 = iVar233 + 4;
              uVar238 = uVar13 & 0xfffffffc;
            } while (iVar233 < (int)uVar13);
          }
          if ((int)(uVar238 | 1) < (int)uVar13) {
            lVar239 = 0;
            uVar237 = uVar238;
            do {
              pfVar234 = (float *)((long)pfVar230 + lVar239 + 0x20);
              fVar16 = *pfVar234;
              fVar17 = pfVar234[1];
              fVar18 = pfVar234[2];
              fVar19 = pfVar234[3];
              fVar20 = pfVar234[4];
              fVar21 = pfVar234[5];
              fVar22 = pfVar234[6];
              fVar23 = pfVar234[7];
              pfVar234 = (float *)((long)pfVar230 + lVar239 + 0x40);
              fVar24 = *pfVar234;
              fVar25 = pfVar234[1];
              fVar26 = pfVar234[2];
              fVar27 = pfVar234[3];
              fVar28 = pfVar234[4];
              fVar29 = pfVar234[5];
              fVar30 = pfVar234[6];
              fVar31 = pfVar234[7];
              pfVar234 = (float *)((long)pvVar15 + lVar243);
              fVar32 = *pfVar234;
              fVar33 = pfVar234[1];
              fVar34 = pfVar234[2];
              fVar35 = pfVar234[3];
              fVar36 = pfVar234[4];
              fVar37 = pfVar234[5];
              fVar38 = pfVar234[6];
              fVar39 = pfVar234[7];
              pfVar234 = (float *)((long)pvVar15 + lVar243 + 0x20);
              fVar40 = *pfVar234;
              fVar41 = pfVar234[1];
              fVar42 = pfVar234[2];
              fVar43 = pfVar234[3];
              fVar44 = pfVar234[4];
              fVar45 = pfVar234[5];
              fVar46 = pfVar234[6];
              fVar47 = pfVar234[7];
              pfVar234 = (float *)((long)pvVar15 + lVar243 + 0x40);
              fVar48 = *pfVar234;
              fVar49 = pfVar234[1];
              fVar50 = pfVar234[2];
              fVar51 = pfVar234[3];
              fVar52 = pfVar234[4];
              fVar53 = pfVar234[5];
              fVar54 = pfVar234[6];
              pfVar234 = (float *)((long)pfVar230 + lVar239);
              fVar55 = pfVar234[1];
              fVar56 = pfVar234[2];
              fVar57 = pfVar234[3];
              fVar58 = pfVar234[4];
              fVar59 = pfVar234[5];
              fVar60 = pfVar234[6];
              pfVar232 = (float *)((long)pvVar15 + lVar243 + 0x60);
              fVar61 = *pfVar232;
              fVar62 = pfVar232[1];
              fVar63 = pfVar232[2];
              fVar64 = pfVar232[3];
              fVar65 = pfVar232[4];
              fVar66 = pfVar232[5];
              fVar67 = pfVar232[6];
              fVar68 = pfVar232[7];
              fVar257 = fVar280 + in_register_0000135c;
              pfVar232 = (float *)((long)pfVar230 + lVar239 + 0x60);
              fVar69 = *pfVar232;
              fVar70 = pfVar232[1];
              fVar71 = pfVar232[2];
              fVar72 = pfVar232[3];
              fVar73 = pfVar232[4];
              fVar74 = pfVar232[5];
              fVar75 = pfVar232[6];
              pfVar232 = (float *)((long)pvVar15 + lVar243 + 0x80);
              fVar76 = *pfVar232;
              fVar77 = pfVar232[1];
              fVar78 = pfVar232[2];
              fVar79 = pfVar232[3];
              fVar80 = pfVar232[4];
              fVar81 = pfVar232[5];
              fVar82 = pfVar232[6];
              fVar83 = pfVar232[7];
              pfVar232 = (float *)((long)pvVar15 + lVar243 + 0xa0);
              fVar84 = *pfVar232;
              fVar85 = pfVar232[1];
              fVar86 = pfVar232[2];
              fVar87 = pfVar232[3];
              fVar88 = pfVar232[4];
              fVar89 = pfVar232[5];
              fVar90 = pfVar232[6];
              fVar91 = pfVar232[7];
              pfVar232 = (float *)((long)pfVar244 + lVar239 + 0x20);
              fVar92 = *pfVar232;
              fVar93 = pfVar232[1];
              fVar94 = pfVar232[2];
              fVar95 = pfVar232[3];
              fVar96 = pfVar232[4];
              fVar97 = pfVar232[5];
              fVar98 = pfVar232[6];
              fVar99 = pfVar232[7];
              pfVar232 = (float *)((long)pfVar244 + lVar239 + 0x40);
              fVar100 = *pfVar232;
              fVar101 = pfVar232[1];
              fVar102 = pfVar232[2];
              fVar103 = pfVar232[3];
              fVar104 = pfVar232[4];
              fVar105 = pfVar232[5];
              fVar106 = pfVar232[6];
              fVar107 = pfVar232[7];
              pfVar232 = (float *)((long)pfVar244 + lVar239);
              fVar108 = pfVar232[1];
              fVar109 = pfVar232[2];
              fVar110 = pfVar232[3];
              fVar111 = pfVar232[4];
              fVar112 = pfVar232[5];
              fVar113 = pfVar232[6];
              pfVar245 = (float *)((long)pfVar244 + lVar239 + 0x60);
              fVar114 = *pfVar245;
              fVar115 = pfVar245[1];
              fVar116 = pfVar245[2];
              fVar117 = pfVar245[3];
              fVar261 = pfVar245[4];
              fVar263 = pfVar245[5];
              fVar118 = pfVar245[6];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0xc0);
              fVar119 = *pfVar245;
              fVar120 = pfVar245[1];
              fVar121 = pfVar245[2];
              fVar122 = pfVar245[3];
              fVar123 = pfVar245[4];
              fVar124 = pfVar245[5];
              fVar125 = pfVar245[6];
              fVar126 = pfVar245[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0xe0);
              fVar271 = *pfVar245;
              fVar127 = pfVar245[1];
              fVar128 = pfVar245[2];
              fVar129 = pfVar245[3];
              fVar130 = pfVar245[4];
              fVar131 = pfVar245[5];
              fVar132 = pfVar245[6];
              fVar133 = pfVar245[7];
              pfVar245 = (float *)((long)pvVar15 + lVar243 + 0x100);
              fVar134 = *pfVar245;
              fVar135 = pfVar245[1];
              fVar136 = pfVar245[2];
              fVar137 = pfVar245[3];
              fVar138 = pfVar245[4];
              fVar139 = pfVar245[5];
              fVar140 = pfVar245[6];
              pfVar3 = (float *)((long)pfVar231 + lVar239 + 0x20);
              fVar141 = *pfVar3;
              fVar142 = pfVar3[1];
              fVar143 = pfVar3[2];
              fVar259 = pfVar3[3];
              fVar144 = pfVar3[4];
              fVar145 = pfVar3[5];
              fVar146 = pfVar3[6];
              pfVar245 = (float *)((long)pfVar231 + lVar239 + 0x40);
              fVar160 = *pfVar245;
              fVar161 = pfVar245[1];
              fVar162 = pfVar245[2];
              fVar163 = pfVar245[3];
              fVar164 = pfVar245[4];
              fVar165 = pfVar245[5];
              fVar166 = pfVar245[6];
              in_register_0000139c = pfVar245[7];
              pfVar245 = (float *)((long)pfVar231 + lVar239);
              fVar147 = pfVar245[1];
              fVar148 = pfVar245[2];
              fVar149 = pfVar245[3];
              fVar150 = pfVar245[4];
              fVar151 = pfVar245[5];
              fVar152 = pfVar245[6];
              in_register_0000135c = in_register_000013dc + pfVar3[7];
              in_register_000012dc = in_register_0000135c + fVar133;
              pfVar3 = (float *)((long)pfVar231 + lVar239 + 0x60);
              fVar153 = *pfVar3;
              fVar154 = pfVar3[1];
              fVar155 = pfVar3[2];
              fVar156 = pfVar3[3];
              fVar157 = pfVar3[4];
              fVar158 = pfVar3[5];
              fVar159 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar242 + lVar239);
              *pfVar3 = fVar273 + fVar32 * *pfVar234 + fVar16 * fVar40 + fVar24 * fVar48 +
                        fVar61 * *pfVar232 + fVar92 * fVar76 + fVar100 * fVar84 +
                        fVar119 * *pfVar245 + fVar141 * fVar271 + fVar160 * fVar134;
              pfVar3[1] = fVar274 + fVar33 * fVar55 + fVar17 * fVar41 + fVar25 * fVar49 +
                          fVar62 * fVar108 + fVar93 * fVar77 + fVar101 * fVar85 +
                          fVar120 * fVar147 + fVar142 * fVar127 + fVar161 * fVar135;
              pfVar3[2] = fVar275 + fVar34 * fVar56 + fVar18 * fVar42 + fVar26 * fVar50 +
                          fVar63 * fVar109 + fVar94 * fVar78 + fVar102 * fVar86 +
                          fVar121 * fVar148 + fVar143 * fVar128 + fVar162 * fVar136;
              pfVar3[3] = fVar276 + fVar35 * fVar57 + fVar19 * fVar43 + fVar27 * fVar51 +
                          fVar64 * fVar110 + fVar95 * fVar79 + fVar103 * fVar87 +
                          fVar122 * fVar149 + fVar259 * fVar129 + fVar163 * fVar137;
              pfVar3[4] = fVar277 + fVar36 * fVar58 + fVar20 * fVar44 + fVar28 * fVar52 +
                          fVar65 * fVar111 + fVar96 * fVar80 + fVar104 * fVar88 +
                          fVar123 * fVar150 + fVar144 * fVar130 + fVar164 * fVar138;
              pfVar3[5] = fVar278 + fVar37 * fVar59 + fVar21 * fVar45 + fVar29 * fVar53 +
                          fVar66 * fVar112 + fVar97 * fVar81 + fVar105 * fVar89 +
                          fVar124 * fVar151 + fVar145 * fVar131 + fVar165 * fVar139;
              pfVar3[6] = fVar279 + fVar38 * fVar60 + fVar22 * fVar46 + fVar30 * fVar54 +
                          fVar67 * fVar113 + fVar98 * fVar82 + fVar106 * fVar90 +
                          fVar125 * fVar152 + fVar146 * fVar132 + fVar166 * fVar140;
              pfVar3[7] = fVar257 + fVar23 + fVar31 + in_register_000013dc + fVar99 + fVar107 +
                          in_register_000012dc;
              pfVar234 = (float *)((long)pfVar242 + lVar239 + 0x20);
              *pfVar234 = fVar273 + fVar16 * fVar32 + fVar24 * fVar40 + fVar48 * fVar69 +
                          fVar92 * fVar61 + fVar100 * fVar76 + fVar84 * fVar114 +
                          fVar141 * fVar119 + fVar160 * fVar271 + fVar134 * fVar153;
              pfVar234[1] = fVar274 + fVar17 * fVar33 + fVar25 * fVar41 + fVar49 * fVar70 +
                            fVar93 * fVar62 + fVar101 * fVar77 + fVar85 * fVar115 +
                            fVar142 * fVar120 + fVar161 * fVar127 + fVar135 * fVar154;
              pfVar234[2] = fVar275 + fVar18 * fVar34 + fVar26 * fVar42 + fVar50 * fVar71 +
                            fVar94 * fVar63 + fVar102 * fVar78 + fVar86 * fVar116 +
                            fVar143 * fVar121 + fVar162 * fVar128 + fVar136 * fVar155;
              pfVar234[3] = fVar276 + fVar19 * fVar35 + fVar27 * fVar43 + fVar51 * fVar72 +
                            fVar95 * fVar64 + fVar103 * fVar79 + fVar87 * fVar117 +
                            fVar259 * fVar122 + fVar163 * fVar129 + fVar137 * fVar156;
              pfVar234[4] = fVar277 + fVar20 * fVar36 + fVar28 * fVar44 + fVar52 * fVar73 +
                            fVar96 * fVar65 + fVar104 * fVar80 + fVar88 * fVar261 +
                            fVar144 * fVar123 + fVar164 * fVar130 + fVar138 * fVar157;
              pfVar234[5] = fVar278 + fVar21 * fVar37 + fVar29 * fVar45 + fVar53 * fVar74 +
                            fVar97 * fVar66 + fVar105 * fVar81 + fVar89 * fVar263 +
                            fVar145 * fVar124 + fVar165 * fVar131 + fVar139 * fVar158;
              pfVar234[6] = fVar279 + fVar22 * fVar38 + fVar30 * fVar46 + fVar54 * fVar75 +
                            fVar98 * fVar67 + fVar106 * fVar82 + fVar90 * fVar118 +
                            fVar146 * fVar125 + fVar166 * fVar132 + fVar140 * fVar159;
              pfVar234[7] = fVar280 + fVar39 + fVar47 + fVar31 + fVar68 + fVar83 + fVar91 +
                            fVar126 + fVar133 + in_register_000012dc;
              uVar238 = uVar237 + 2;
              iVar233 = uVar237 + 3;
              lVar239 = lVar239 + 0x40;
              uVar237 = uVar238;
            } while (iVar233 < (int)uVar13);
            pfVar231 = (float *)((long)pfVar231 + lVar239);
            pfVar244 = (float *)((long)pfVar244 + lVar239);
            pfVar230 = (float *)((long)pfVar230 + lVar239);
            pfVar242 = (float *)((long)pfVar242 + lVar239);
          }
          if ((int)uVar238 < (int)uVar13) {
            iVar233 = uVar13 - uVar238;
            pfVar234 = pfVar230;
            pfVar232 = pfVar231;
            pfVar245 = pfVar244;
            do {
              pfVar230 = pfVar234 + 8;
              fVar16 = pfVar234[1];
              fVar17 = pfVar234[2];
              fVar18 = pfVar234[3];
              fVar19 = pfVar234[4];
              fVar20 = pfVar234[5];
              fVar21 = pfVar234[6];
              fVar22 = pfVar234[7];
              fVar23 = pfVar234[9];
              fVar24 = pfVar234[10];
              fVar25 = pfVar234[0xb];
              fVar26 = pfVar234[0xc];
              fVar27 = pfVar234[0xd];
              fVar28 = pfVar234[0xe];
              fVar29 = pfVar234[0xf];
              pfVar6 = (float *)((long)pvVar15 + lVar243);
              fVar30 = pfVar6[1];
              fVar31 = pfVar6[2];
              fVar32 = pfVar6[3];
              fVar33 = pfVar6[4];
              fVar34 = pfVar6[5];
              fVar35 = pfVar6[6];
              fVar36 = pfVar234[0x11];
              fVar37 = pfVar234[0x12];
              fVar38 = pfVar234[0x13];
              fVar39 = pfVar234[0x14];
              fVar40 = pfVar234[0x15];
              fVar41 = pfVar234[0x16];
              fVar42 = pfVar234[0x17];
              pfVar3 = (float *)((long)pvVar15 + lVar243 + 0x20);
              fVar43 = pfVar3[1];
              fVar44 = pfVar3[2];
              fVar45 = pfVar3[3];
              fVar46 = pfVar3[4];
              fVar47 = pfVar3[5];
              fVar48 = pfVar3[6];
              pfVar4 = (float *)((long)pvVar15 + lVar243 + 0x40);
              fVar49 = pfVar4[1];
              fVar50 = pfVar4[2];
              fVar51 = pfVar4[3];
              fVar52 = pfVar4[4];
              fVar53 = pfVar4[5];
              fVar54 = pfVar4[6];
              pfVar244 = pfVar245 + 8;
              fVar55 = pfVar245[1];
              fVar56 = pfVar245[2];
              fVar57 = pfVar245[3];
              fVar58 = pfVar245[4];
              fVar59 = pfVar245[5];
              fVar60 = pfVar245[6];
              fVar61 = pfVar245[7];
              fVar62 = pfVar245[9];
              fVar63 = pfVar245[10];
              fVar64 = pfVar245[0xb];
              fVar65 = pfVar245[0xc];
              fVar66 = pfVar245[0xd];
              fVar67 = pfVar245[0xe];
              fVar68 = pfVar245[0xf];
              fVar69 = pfVar245[0x11];
              fVar70 = pfVar245[0x12];
              fVar71 = pfVar245[0x13];
              fVar72 = pfVar245[0x14];
              fVar73 = pfVar245[0x15];
              fVar74 = pfVar245[0x16];
              pfVar5 = (float *)((long)pvVar15 + lVar243 + 0x60);
              fVar75 = pfVar5[1];
              fVar76 = pfVar5[2];
              fVar77 = pfVar5[3];
              fVar78 = pfVar5[4];
              fVar79 = pfVar5[5];
              fVar80 = pfVar5[6];
              pfVar7 = (float *)((long)pvVar15 + lVar243 + 0x80);
              fVar81 = pfVar7[1];
              fVar82 = pfVar7[2];
              fVar83 = pfVar7[3];
              fVar84 = pfVar7[4];
              fVar85 = pfVar7[5];
              fVar86 = pfVar7[6];
              pfVar8 = (float *)((long)pvVar15 + lVar243 + 0xa0);
              fVar87 = pfVar8[1];
              fVar88 = pfVar8[2];
              fVar89 = pfVar8[3];
              fVar90 = pfVar8[4];
              fVar91 = pfVar8[5];
              fVar92 = pfVar8[6];
              pfVar231 = pfVar232 + 8;
              fVar93 = pfVar232[1];
              fVar94 = pfVar232[2];
              fVar95 = pfVar232[3];
              fVar96 = pfVar232[4];
              fVar97 = pfVar232[5];
              fVar98 = pfVar232[6];
              fVar99 = pfVar232[7];
              fVar100 = pfVar232[9];
              fVar101 = pfVar232[10];
              fVar102 = pfVar232[0xb];
              fVar103 = pfVar232[0xc];
              fVar104 = pfVar232[0xd];
              fVar105 = pfVar232[0xe];
              fVar106 = pfVar232[0xf];
              pfVar9 = (float *)((long)pvVar15 + lVar243 + 0xc0);
              fVar107 = pfVar9[1];
              fVar108 = pfVar9[2];
              fVar109 = pfVar9[3];
              fVar110 = pfVar9[4];
              fVar111 = pfVar9[5];
              fVar112 = pfVar9[6];
              pfVar10 = (float *)((long)pvVar15 + lVar243 + 0xe0);
              fVar113 = pfVar10[1];
              fVar114 = pfVar10[2];
              fVar115 = pfVar10[3];
              fVar116 = pfVar10[4];
              fVar117 = pfVar10[5];
              fVar261 = pfVar10[6];
              fVar123 = pfVar232[0x11];
              fVar124 = pfVar232[0x12];
              fVar125 = pfVar232[0x13];
              fVar126 = pfVar232[0x14];
              fVar271 = pfVar232[0x15];
              fVar127 = pfVar232[0x16];
              in_register_000012dc = pfVar232[0x17];
              pfVar11 = (float *)((long)pvVar15 + lVar243 + 0x100);
              fVar263 = pfVar11[1];
              fVar118 = pfVar11[2];
              fVar119 = pfVar11[3];
              fVar120 = pfVar11[4];
              fVar121 = pfVar11[5];
              fVar122 = pfVar11[6];
              *pfVar242 = fVar273 + *pfVar234 * *pfVar6 +
                          pfVar234[8] * *pfVar3 + pfVar234[0x10] * *pfVar4 +
                          *pfVar245 * *pfVar5 + pfVar245[8] * *pfVar7 + pfVar245[0x10] * *pfVar8 +
                          *pfVar232 * *pfVar9 + pfVar232[8] * *pfVar10 + pfVar232[0x10] * *pfVar11;
              pfVar242[1] = fVar274 + fVar16 * fVar30 + fVar23 * fVar43 + fVar36 * fVar49 +
                            fVar55 * fVar75 + fVar62 * fVar81 + fVar69 * fVar87 +
                            fVar93 * fVar107 + fVar100 * fVar113 + fVar123 * fVar263;
              pfVar242[2] = fVar275 + fVar17 * fVar31 + fVar24 * fVar44 + fVar37 * fVar50 +
                            fVar56 * fVar76 + fVar63 * fVar82 + fVar70 * fVar88 +
                            fVar94 * fVar108 + fVar101 * fVar114 + fVar124 * fVar118;
              pfVar242[3] = fVar276 + fVar18 * fVar32 + fVar25 * fVar45 + fVar38 * fVar51 +
                            fVar57 * fVar77 + fVar64 * fVar83 + fVar71 * fVar89 +
                            fVar95 * fVar109 + fVar102 * fVar115 + fVar125 * fVar119;
              pfVar242[4] = fVar277 + fVar19 * fVar33 + fVar26 * fVar46 + fVar39 * fVar52 +
                            fVar58 * fVar78 + fVar65 * fVar84 + fVar72 * fVar90 +
                            fVar96 * fVar110 + fVar103 * fVar116 + fVar126 * fVar120;
              pfVar242[5] = fVar278 + fVar20 * fVar34 + fVar27 * fVar47 + fVar40 * fVar53 +
                            fVar59 * fVar79 + fVar66 * fVar85 + fVar73 * fVar91 +
                            fVar97 * fVar111 + fVar104 * fVar117 + fVar271 * fVar121;
              pfVar242[6] = fVar279 + fVar21 * fVar35 + fVar28 * fVar48 + fVar41 * fVar54 +
                            fVar60 * fVar80 + fVar67 * fVar86 + fVar74 * fVar92 +
                            fVar98 * fVar112 + fVar105 * fVar261 + fVar127 * fVar122;
              pfVar242[7] = fVar280 + fVar22 + fVar29 + fVar42 + fVar61 + fVar68 + fVar68 +
                            fVar99 + fVar106 + fVar106;
              pfVar242 = pfVar242 + 8;
              iVar233 = iVar233 + -1;
              pfVar234 = pfVar230;
              pfVar232 = pfVar231;
              pfVar245 = pfVar244;
            } while (iVar233 != 0);
          }
          pfVar230 = pfVar230 + 0x10;
          pfVar244 = pfVar244 + 0x10;
          pfVar231 = pfVar231 + 0x10;
          uVar241 = uVar241 + 1;
        } while (uVar241 != uVar14);
      }
      lVar236 = lVar236 + 1;
    } while (lVar236 != iVar12);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);
        float* outptr1 = out.row(1);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);

        int i = 0;
        for (; i + 1 < outh; i += 2)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum02 = _bias0;
                __m256 _sum03 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;
                __m256 _sum12 = _bias0;
                __m256 _sum13 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k00, _r02, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k00, _r03, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k01, _r03, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k01, _r04, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k02, _r04, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k02, _r05, _sum03);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k00, _r12, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k00, _r13, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k10, _r12, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k10, _r13, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k01, _r13, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k01, _r14, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k11, _r13, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k11, _r14, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k02, _r14, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k02, _r15, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k12, _r14, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k12, _r15, _sum03);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k10, _r22, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k10, _r23, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k20, _r22, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k20, _r23, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k11, _r23, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k11, _r24, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k21, _r23, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k21, _r24, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k12, _r24, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k12, _r25, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k22, _r24, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k22, _r25, _sum03);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);
                __m256 _r34 = _mm256_load_ps(r3 + 32);
                __m256 _r35 = _mm256_load_ps(r3 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k20, _r32, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k20, _r33, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k21, _r33, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k21, _r34, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k22, _r34, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k22, _r35, _sum13);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr0 + 16, _sum02);
                _mm256_store_ps(outptr0 + 24, _sum03);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);
                _mm256_store_ps(outptr1 + 16, _sum12);
                _mm256_store_ps(outptr1 + 24, _sum13);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                r3 += 32;
                outptr0 += 32;
                outptr1 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                r3 += 16;
                outptr0 += 16;
                outptr1 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r10, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r12, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r20, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r22, _sum1);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);

                _sum1 = _mm256_comp_fmadd_ps(_k20, _r30, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r31, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r32, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr1, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                r3 += 8;
                outptr0 += 8;
                outptr1 += 8;
            }

            r0 += 2 * 8 + w * 8;
            r1 += 2 * 8 + w * 8;
            r2 += 2 * 8 + w * 8;
            r3 += 2 * 8 + w * 8;

            outptr0 += outw * 8;
            outptr1 += outw * 8;
        }
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;
                __m256 _sum2 = _bias0;
                __m256 _sum3 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);
                _mm256_store_ps(outptr0 + 16, _sum2);
                _mm256_store_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}